

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86_fma::forward
          (InnerProduct_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  uint uVar3;
  _func_int *p_Var4;
  int *piVar5;
  long lVar6;
  void *pvVar7;
  size_t sVar8;
  float *pfVar9;
  void *pvVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  ulong uVar23;
  undefined8 uVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [32];
  undefined1 (*pauVar29) [32];
  ulong uVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar53 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar48 [16];
  undefined1 auVar60 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar67;
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [64];
  __m128 pos;
  undefined1 auVar110 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar111 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar154;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar191 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar266 [16];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [16];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [64];
  long local_150;
  int local_140;
  long local_110;
  undefined1 local_d8 [16];
  size_t local_c8;
  int local_c0;
  Allocator *local_b8;
  int local_b0;
  int local_ac;
  undefined8 local_a8;
  int local_a0;
  size_t local_98;
  long local_90;
  ulong local_88;
  long local_80;
  Option opt_flatten;
  undefined1 auVar49 [32];
  undefined1 auVar52 [32];
  undefined1 auVar61 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  
  if ((opt->use_int8_inference == true) &&
     (*(int *)(&this->field_0xdc + (long)this->_vptr_InnerProduct_x86_fma[-3]) != 0)) {
    iVar25 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar25;
  }
  iVar25 = cpu_support_x86_f16c();
  if ((iVar25 != 0) && (opt->use_fp16_storage == true)) {
    iVar25 = forward_fp16s(this,bottom_blob,top_blob,opt);
    return iVar25;
  }
  local_b0 = bottom_blob->dims;
  if (local_b0 == 2) {
    local_ac = bottom_blob->w;
    if (local_ac ==
        *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86_fma[-3]) /
        *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3])) {
      Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]),
                  bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      p_Var4 = this->_vptr_InnerProduct_x86_fma[-3];
      innerproduct_gemm_sse
                (bottom_blob,top_blob,&this->weight_data_tm,
                 (Mat *)(&this->field_0x178 + (long)p_Var4),
                 *(int *)(&this->field_0xe0 + (long)p_Var4),
                 (Mat *)(&this->field_0xe8 + (long)p_Var4),opt);
      return 0;
    }
  }
  else {
    local_ac = bottom_blob->w;
  }
  piVar5 = bottom_blob->refcount;
  local_d8._0_8_ = bottom_blob->data;
  local_d8._8_8_ = bottom_blob->refcount;
  local_c8 = bottom_blob->elemsize;
  local_c0 = bottom_blob->elempack;
  local_b8 = bottom_blob->allocator;
  local_a8._0_4_ = bottom_blob->h;
  local_a8._4_4_ = bottom_blob->d;
  local_a0 = bottom_blob->c;
  local_98 = bottom_blob->cstep;
  iVar25 = local_b0;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + 1;
    UNLOCK();
    iVar25 = bottom_blob->dims;
  }
  if (iVar25 != 1) {
    auVar64[0] = opt->lightmode;
    auVar64._1_3_ = *(undefined3 *)&opt->field_0x1;
    auVar64._4_4_ = opt->num_threads;
    auVar64._8_8_ = opt->blob_allocator;
    auVar64._16_8_ = opt->workspace_allocator;
    auVar64._24_4_ = opt->openmp_blocktime;
    auVar64[0x1c] = opt->use_winograd_convolution;
    auVar64[0x1d] = opt->use_sgemm_convolution;
    auVar64[0x1e] = opt->use_int8_inference;
    auVar64[0x1f] = opt->use_vulkan_compute;
    opt_flatten.use_bf16_storage = opt->use_bf16_storage;
    opt_flatten.use_fp16_packed = opt->use_fp16_packed;
    opt_flatten.use_fp16_storage = opt->use_fp16_storage;
    opt_flatten.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_flatten.use_int8_packed = opt->use_int8_packed;
    opt_flatten.use_int8_storage = opt->use_int8_storage;
    opt_flatten.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_flatten.use_packing_layout = opt->use_packing_layout;
    opt_flatten.use_shader_pack8 = opt->use_shader_pack8;
    opt_flatten.use_subgroup_basic = opt->use_subgroup_basic;
    opt_flatten.use_subgroup_vote = opt->use_subgroup_vote;
    opt_flatten.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_flatten.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_flatten.use_image_storage = opt->use_image_storage;
    opt_flatten.use_tensor_storage = opt->use_tensor_storage;
    opt_flatten.use_reserved_0 = opt->use_reserved_0;
    opt_flatten.flush_denormals = opt->flush_denormals;
    opt_flatten.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_flatten.use_shader_local_memory = opt->use_shader_local_memory;
    opt_flatten.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_flatten.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_flatten.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_flatten.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_flatten.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_flatten.use_reserved_7 = opt->use_reserved_7;
    opt_flatten.use_reserved_8 = opt->use_reserved_8;
    opt_flatten.use_reserved_9 = opt->use_reserved_9;
    opt_flatten.use_reserved_10 = opt->use_reserved_10;
    opt_flatten.use_reserved_11 = opt->use_reserved_11;
    opt_flatten._0_8_ = auVar64._0_8_;
    opt_flatten.blob_allocator = opt->workspace_allocator;
    opt_flatten.workspace_allocator = (Allocator *)auVar64._16_8_;
    opt_flatten.openmp_blocktime = auVar64._24_4_;
    opt_flatten.use_winograd_convolution = (bool)auVar64[0x1c];
    opt_flatten.use_sgemm_convolution = (bool)auVar64[0x1d];
    opt_flatten.use_int8_inference = (bool)auVar64[0x1e];
    opt_flatten.use_vulkan_compute = (bool)auVar64[0x1f];
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,local_d8);
  }
  uVar3 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]);
  if (opt->use_packing_layout == true) {
    uVar26 = 8;
    if ((uVar3 & 7) != 0) {
      uVar26 = (uint)((uVar3 & 3) == 0) * 3 + 1;
    }
  }
  else {
    uVar26 = 1;
  }
  Mat::create(top_blob,(int)uVar3 / (int)uVar26,(ulong)uVar26 * (local_c8 / (ulong)(long)local_c0),
              uVar26,opt->blob_allocator);
  local_140 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    p_Var4 = this->_vptr_InnerProduct_x86_fma[-3];
    iVar25 = *(int *)(&this->field_0xe0 + (long)p_Var4);
    iVar32 = local_c0 * local_ac;
    iVar35 = top_blob->elempack;
    uVar3 = top_blob->w;
    lVar6 = *(long *)(&this->field_0x178 + (long)p_Var4);
    uVar24 = local_d8._0_8_;
    if (iVar35 == 1) {
      lVar31 = (long)iVar32;
      uVar30 = 0;
      local_88 = (ulong)(uint)((int)uVar3 >> 3);
      if ((int)uVar3 >> 3 < 1) {
        local_88 = uVar30;
      }
      local_90 = lVar31 * 0x20;
      lVar33 = lVar31 * 4;
      lVar34 = lVar31 * 8;
      lVar36 = lVar31 * 0xc;
      lVar41 = lVar31 << 4;
      lVar38 = lVar31 * 0x14;
      local_110 = lVar31 * 0x18;
      local_150 = lVar31 * 0x1c;
      auVar343._8_4_ = 0x3f000000;
      auVar343._0_8_ = 0x3f0000003f000000;
      auVar343._12_4_ = 0x3f000000;
      auVar343._16_4_ = 0x3f000000;
      auVar343._20_4_ = 0x3f000000;
      auVar343._24_4_ = 0x3f000000;
      auVar343._28_4_ = 0x3f000000;
      auVar220 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar344 = ZEXT1664(ZEXT816(0) << 0x40);
      for (uVar27 = 0; uVar27 != local_88; uVar27 = uVar27 + 1) {
        local_80 = uVar27 * 8;
        auVar70 = ZEXT816(0);
        auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
        if (lVar6 != 0) {
          auVar65 = ZEXT3264(*(undefined1 (*) [32])(lVar6 + uVar27 * 0x20));
        }
        pvVar7 = (this->weight_data_tm).data;
        lVar37 = 0;
        lVar39 = 0;
        auVar82 = ZEXT816(0) << 0x40;
        auVar68 = ZEXT816(0) << 0x40;
        auVar48 = ZEXT816(0) << 0x40;
        auVar72 = ZEXT816(0) << 0x40;
        auVar185 = ZEXT816(0) << 0x40;
        auVar113 = ZEXT816(0) << 0x40;
        auVar110 = ZEXT816(0) << 0x40;
        iVar35 = 0;
        while( true ) {
          if (iVar32 <= iVar35 + 7) break;
          auVar64 = *(undefined1 (*) [32])((undefined1 *)local_d8._0_8_ + lVar39);
          auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar64,
                                     *(undefined1 (*) [32])((long)pvVar7 + lVar39 + uVar30));
          auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar64,
                                     *(undefined1 (*) [32])((long)pvVar7 + lVar39 + lVar33));
          auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar64,
                                     *(undefined1 (*) [32])((long)pvVar7 + lVar39 + lVar34));
          auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar64,
                                    *(undefined1 (*) [32])((long)pvVar7 + lVar39 + lVar36));
          auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar64,
                                    *(undefined1 (*) [32])((long)pvVar7 + lVar39 + lVar41));
          auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar64,
                                    *(undefined1 (*) [32])((long)pvVar7 + lVar39 + lVar38));
          auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar64,
                                    *(undefined1 (*) [32])((long)pvVar7 + lVar39 + local_110));
          auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar64,
                                    *(undefined1 (*) [32])((long)pvVar7 + lVar39 + local_150));
          iVar35 = iVar35 + 8;
          lVar39 = lVar39 + 0x20;
          lVar37 = lVar37 + 8;
        }
        for (; (int)lVar37 < iVar32; lVar37 = lVar37 + 1) {
          auVar122 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar7 + lVar37 * 4 + lVar41)),
                                   ZEXT416(*(uint *)((long)pvVar7 + lVar37 * 4 + lVar38)),0x10);
          auVar122 = vinsertps_avx(auVar122,ZEXT416(*(uint *)((long)pvVar7 + lVar37 * 4 + local_110)
                                                   ),0x20);
          auVar122 = vinsertps_avx(auVar122,ZEXT416(*(uint *)((long)pvVar7 + lVar37 * 4 + local_150)
                                                   ),0x30);
          auVar81 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar7 + lVar37 * 4 + uVar30)),
                                  ZEXT416(*(uint *)((long)pvVar7 + lVar37 * 4 + lVar33)),0x10);
          auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)((long)pvVar7 + lVar37 * 4 + lVar34)),
                                  0x20);
          auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)((long)pvVar7 + lVar37 * 4 + lVar36)),
                                  0x30);
          auVar51._16_16_ = auVar122;
          auVar51._0_16_ = auVar81;
          uVar1 = *(undefined4 *)((undefined1 *)local_d8._0_8_ + lVar37 * 4);
          auVar54._4_4_ = uVar1;
          auVar54._0_4_ = uVar1;
          auVar54._8_4_ = uVar1;
          auVar54._12_4_ = uVar1;
          auVar54._16_4_ = uVar1;
          auVar54._20_4_ = uVar1;
          auVar54._24_4_ = uVar1;
          auVar54._28_4_ = uVar1;
          auVar122 = vfmadd231ps_fma(auVar65._0_32_,auVar51,auVar54);
          auVar65 = ZEXT1664(auVar122);
        }
        auVar64 = vhaddps_avx(ZEXT1632(auVar110),ZEXT1632(auVar113));
        auVar51 = vhaddps_avx(ZEXT1632(auVar185),ZEXT1632(auVar72));
        auVar51 = vhaddps_avx(auVar64,auVar51);
        auVar64 = vhaddps_avx(ZEXT1632(auVar48),ZEXT1632(auVar68));
        auVar54 = vhaddps_avx(ZEXT1632(auVar82),ZEXT1632(auVar70));
        auVar54 = vhaddps_avx(auVar64,auVar54);
        auVar64 = vblendps_avx(auVar51,auVar54,0xf0);
        auVar51 = vperm2f128_avx(auVar51,auVar54,0x21);
        fVar42 = auVar51._0_4_ + auVar65._0_4_ + auVar64._0_4_;
        fVar67 = auVar51._4_4_ + auVar65._4_4_ + auVar64._4_4_;
        auVar244._0_8_ = CONCAT44(fVar67,fVar42);
        auVar244._8_4_ = auVar51._8_4_ + auVar65._8_4_ + auVar64._8_4_;
        auVar244._12_4_ = auVar51._12_4_ + auVar65._12_4_ + auVar64._12_4_;
        auVar244._16_4_ = auVar51._16_4_ + auVar65._16_4_ + auVar64._16_4_;
        auVar244._20_4_ = auVar51._20_4_ + auVar65._20_4_ + auVar64._20_4_;
        auVar244._24_4_ = auVar51._24_4_ + auVar65._24_4_ + auVar64._24_4_;
        auVar244._28_4_ = auVar51._28_4_ + auVar65._28_4_ + auVar64._28_4_;
        auVar64 = auVar244;
        if (5 < iVar25 - 1U) goto switchD_002a8b8b_caseD_1;
        auVar54 = auVar344._0_32_;
        auVar64 = vmaxps_avx(auVar54,auVar244);
        auVar51 = auVar220._0_32_;
        fVar2 = auVar220._0_4_;
        fVar154 = auVar220._4_4_;
        fVar11 = auVar220._8_4_;
        fVar12 = auVar220._12_4_;
        fVar13 = auVar220._16_4_;
        fVar14 = auVar220._20_4_;
        fVar15 = auVar220._24_4_;
        fVar16 = auVar220._28_4_;
        switch(iVar25) {
        case 2:
          auVar51 = vminps_avx(auVar54,auVar244);
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
          auVar148._4_4_ = uVar1;
          auVar148._0_4_ = uVar1;
          auVar148._8_4_ = uVar1;
          auVar148._12_4_ = uVar1;
          auVar148._16_4_ = uVar1;
          auVar148._20_4_ = uVar1;
          auVar148._24_4_ = uVar1;
          auVar148._28_4_ = uVar1;
          auVar70 = vfmadd231ps_fma(auVar64,auVar51,auVar148);
          auVar64 = ZEXT1632(auVar70);
          break;
        case 3:
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
          auVar59._4_4_ = uVar1;
          auVar59._0_4_ = uVar1;
          auVar59._8_4_ = uVar1;
          auVar59._12_4_ = uVar1;
          auVar59._16_4_ = uVar1;
          auVar59._20_4_ = uVar1;
          auVar59._24_4_ = uVar1;
          auVar59._28_4_ = uVar1;
          uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var4))[1];
          auVar103._4_4_ = uVar1;
          auVar103._0_4_ = uVar1;
          auVar103._8_4_ = uVar1;
          auVar103._12_4_ = uVar1;
          auVar103._16_4_ = uVar1;
          auVar103._20_4_ = uVar1;
          auVar103._24_4_ = uVar1;
          auVar103._28_4_ = uVar1;
          auVar64 = vmaxps_avx(auVar244,auVar59);
          auVar64 = vminps_avx(auVar64,auVar103);
          break;
        case 4:
          auVar60._0_8_ = auVar244._0_8_ ^ 0x8000000080000000;
          auVar60._8_4_ = -auVar244._8_4_;
          auVar60._12_4_ = -auVar244._12_4_;
          auVar60._16_4_ = -auVar244._16_4_;
          auVar60._20_4_ = -auVar244._20_4_;
          auVar60._24_4_ = -auVar244._24_4_;
          auVar60._28_4_ = -auVar244._28_4_;
          auVar104._8_4_ = 0x42b0c0a5;
          auVar104._0_8_ = 0x42b0c0a542b0c0a5;
          auVar104._12_4_ = 0x42b0c0a5;
          auVar104._16_4_ = 0x42b0c0a5;
          auVar104._20_4_ = 0x42b0c0a5;
          auVar104._24_4_ = 0x42b0c0a5;
          auVar104._28_4_ = 0x42b0c0a5;
          auVar64 = vminps_avx(auVar60,auVar104);
          auVar105._8_4_ = 0xc2b0c0a5;
          auVar105._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar105._12_4_ = 0xc2b0c0a5;
          auVar105._16_4_ = 0xc2b0c0a5;
          auVar105._20_4_ = 0xc2b0c0a5;
          auVar105._24_4_ = 0xc2b0c0a5;
          auVar105._28_4_ = 0xc2b0c0a5;
          auVar54 = vmaxps_avx(auVar64,auVar105);
          auVar106._8_4_ = 0x3fb8aa3b;
          auVar106._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar106._12_4_ = 0x3fb8aa3b;
          auVar106._16_4_ = 0x3fb8aa3b;
          auVar106._20_4_ = 0x3fb8aa3b;
          auVar106._24_4_ = 0x3fb8aa3b;
          auVar106._28_4_ = 0x3fb8aa3b;
          auVar70 = vfmadd213ps_fma(auVar106,auVar54,auVar343);
          auVar244 = vroundps_avx(ZEXT1632(auVar70),1);
          auVar64 = vcmpps_avx(ZEXT1632(auVar70),auVar244,1);
          auVar64 = vandps_avx(auVar64,auVar51);
          auVar64 = vsubps_avx(auVar244,auVar64);
          auVar152._8_4_ = 0x3f318000;
          auVar152._0_8_ = 0x3f3180003f318000;
          auVar152._12_4_ = 0x3f318000;
          auVar152._16_4_ = 0x3f318000;
          auVar152._20_4_ = 0x3f318000;
          auVar152._24_4_ = 0x3f318000;
          auVar152._28_4_ = 0x3f318000;
          auVar70 = vfmsub231ps_fma(auVar54,auVar64,auVar152);
          auVar153._8_4_ = 0x395e8083;
          auVar153._0_8_ = 0x395e8083395e8083;
          auVar153._12_4_ = 0x395e8083;
          auVar153._16_4_ = 0x395e8083;
          auVar153._20_4_ = 0x395e8083;
          auVar153._24_4_ = 0x395e8083;
          auVar153._28_4_ = 0x395e8083;
          auVar110 = vfmsub231ps_fma(ZEXT1632(auVar70),auVar64,auVar153);
          auVar54 = ZEXT1632(auVar110);
          auVar22._28_4_ = 0x395e8083;
          auVar22._0_28_ =
               ZEXT1628(CONCAT412(auVar110._12_4_ * auVar110._12_4_,
                                  CONCAT48(auVar110._8_4_ * auVar110._8_4_,
                                           CONCAT44(auVar110._4_4_ * auVar110._4_4_,
                                                    auVar110._0_4_ * auVar110._0_4_))));
          auVar201._8_4_ = 0x39506967;
          auVar201._0_8_ = 0x3950696739506967;
          auVar201._12_4_ = 0x39506967;
          auVar201._16_4_ = 0x39506967;
          auVar201._20_4_ = 0x39506967;
          auVar201._24_4_ = 0x39506967;
          auVar201._28_4_ = 0x39506967;
          auVar245._8_4_ = 0x3ab743ce;
          auVar245._0_8_ = 0x3ab743ce3ab743ce;
          auVar245._12_4_ = 0x3ab743ce;
          auVar245._16_4_ = 0x3ab743ce;
          auVar245._20_4_ = 0x3ab743ce;
          auVar245._24_4_ = 0x3ab743ce;
          auVar245._28_4_ = 0x3ab743ce;
          auVar70 = vfmadd213ps_fma(auVar201,auVar54,auVar245);
          auVar219._8_4_ = 0x3c088908;
          auVar219._0_8_ = 0x3c0889083c088908;
          auVar219._12_4_ = 0x3c088908;
          auVar219._16_4_ = 0x3c088908;
          auVar219._20_4_ = 0x3c088908;
          auVar219._24_4_ = 0x3c088908;
          auVar219._28_4_ = 0x3c088908;
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar54,auVar219);
          auVar179._8_4_ = 0x3d2aa9c1;
          auVar179._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar179._12_4_ = 0x3d2aa9c1;
          auVar179._16_4_ = 0x3d2aa9c1;
          auVar179._20_4_ = 0x3d2aa9c1;
          auVar179._24_4_ = 0x3d2aa9c1;
          auVar179._28_4_ = 0x3d2aa9c1;
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar54,auVar179);
          auVar180._8_4_ = 0x3e2aaaaa;
          auVar180._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar180._12_4_ = 0x3e2aaaaa;
          auVar180._16_4_ = 0x3e2aaaaa;
          auVar180._20_4_ = 0x3e2aaaaa;
          auVar180._24_4_ = 0x3e2aaaaa;
          auVar180._28_4_ = 0x3e2aaaaa;
          auVar54 = ZEXT1632(auVar110);
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar54,auVar180);
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar54,auVar343);
          auVar113 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar22,auVar54);
          auVar48._0_4_ = (int)auVar64._0_4_;
          auVar48._4_4_ = (int)auVar64._4_4_;
          auVar48._8_4_ = (int)auVar64._8_4_;
          auVar48._12_4_ = (int)auVar64._12_4_;
          auVar61._16_4_ = (int)auVar64._16_4_;
          auVar61._0_16_ = auVar48;
          auVar61._20_4_ = (int)auVar64._20_4_;
          auVar61._24_4_ = (int)auVar64._24_4_;
          auVar61._28_4_ = (int)auVar64._28_4_;
          auVar110 = vpslld_avx(auVar48,0x17);
          auVar70 = vpslld_avx(auVar61._16_16_,0x17);
          auVar68._8_4_ = 0x3f800000;
          auVar68._0_8_ = 0x3f8000003f800000;
          auVar68._12_4_ = 0x3f800000;
          auVar70 = vpaddd_avx(auVar70,auVar68);
          auVar110 = vpaddd_avx(auVar110,auVar68);
          auVar62._16_16_ = auVar70;
          auVar62._0_16_ = auVar110;
          auVar107._0_4_ = auVar113._0_4_ + fVar2;
          auVar107._4_4_ = auVar113._4_4_ + fVar154;
          auVar107._8_4_ = auVar113._8_4_ + fVar11;
          auVar107._12_4_ = auVar113._12_4_ + fVar12;
          auVar107._16_4_ = fVar13 + 0.0;
          auVar107._20_4_ = fVar14 + 0.0;
          auVar107._24_4_ = fVar15 + 0.0;
          auVar107._28_4_ = fVar16 + 0.0;
          auVar70 = vfmadd213ps_fma(auVar62,auVar107,auVar51);
          auVar64 = vrcpps_avx(ZEXT1632(auVar70));
          auVar70 = vfmsub213ps_fma(ZEXT1632(auVar70),auVar64,auVar51);
          auVar70 = vfnmadd132ps_fma(ZEXT1632(auVar70),auVar64,auVar64);
          auVar64 = ZEXT1632(auVar70);
          break;
        case 5:
          auVar319._8_4_ = 0x42b0c0a5;
          auVar319._0_8_ = 0x42b0c0a542b0c0a5;
          auVar319._12_4_ = 0x42b0c0a5;
          auVar319._16_4_ = 0x42b0c0a5;
          auVar319._20_4_ = 0x42b0c0a5;
          auVar319._24_4_ = 0x42b0c0a5;
          auVar319._28_4_ = 0x42b0c0a5;
          auVar64 = vminps_avx(auVar319,auVar244);
          auVar328._8_4_ = 0xc2b0c0a5;
          auVar328._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar328._12_4_ = 0xc2b0c0a5;
          auVar328._16_4_ = 0xc2b0c0a5;
          auVar328._20_4_ = 0xc2b0c0a5;
          auVar328._24_4_ = 0xc2b0c0a5;
          auVar328._28_4_ = 0xc2b0c0a5;
          auVar54 = vmaxps_avx(auVar328,auVar64);
          auVar95._8_4_ = 0x3fb8aa3b;
          auVar95._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar95._12_4_ = 0x3fb8aa3b;
          auVar95._16_4_ = 0x3fb8aa3b;
          auVar95._20_4_ = 0x3fb8aa3b;
          auVar95._24_4_ = 0x3fb8aa3b;
          auVar95._28_4_ = 0x3fb8aa3b;
          auVar70 = vfmadd213ps_fma(auVar95,auVar54,auVar343);
          auVar63 = vroundps_avx(ZEXT1632(auVar70),1);
          auVar64 = vcmpps_avx(ZEXT1632(auVar70),auVar63,1);
          auVar64 = vandps_avx(auVar64,auVar51);
          auVar64 = vsubps_avx(auVar63,auVar64);
          auVar320._8_4_ = 0x3f318000;
          auVar320._0_8_ = 0x3f3180003f318000;
          auVar320._12_4_ = 0x3f318000;
          auVar320._16_4_ = 0x3f318000;
          auVar320._20_4_ = 0x3f318000;
          auVar320._24_4_ = 0x3f318000;
          auVar320._28_4_ = 0x3f318000;
          auVar70 = vfmsub231ps_fma(auVar54,auVar64,auVar320);
          auVar329._8_4_ = 0xb95e8083;
          auVar329._0_8_ = 0xb95e8083b95e8083;
          auVar329._12_4_ = 0xb95e8083;
          auVar329._16_4_ = 0xb95e8083;
          auVar329._20_4_ = 0xb95e8083;
          auVar329._24_4_ = 0xb95e8083;
          auVar329._28_4_ = 0xb95e8083;
          auVar110 = vfnmsub231ps_fma(ZEXT1632(auVar70),auVar64,auVar329);
          auVar54 = ZEXT1632(auVar110);
          auVar20._28_4_ = auVar63._28_4_;
          auVar20._0_28_ =
               ZEXT1628(CONCAT412(auVar110._12_4_ * auVar110._12_4_,
                                  CONCAT48(auVar110._8_4_ * auVar110._8_4_,
                                           CONCAT44(auVar110._4_4_ * auVar110._4_4_,
                                                    auVar110._0_4_ * auVar110._0_4_))));
          auVar235._8_4_ = 0x39506967;
          auVar235._0_8_ = 0x3950696739506967;
          auVar235._12_4_ = 0x39506967;
          auVar235._16_4_ = 0x39506967;
          auVar235._20_4_ = 0x39506967;
          auVar235._24_4_ = 0x39506967;
          auVar235._28_4_ = 0x39506967;
          auVar336._8_4_ = 0x3ab743ce;
          auVar336._0_8_ = 0x3ab743ce3ab743ce;
          auVar336._12_4_ = 0x3ab743ce;
          auVar336._16_4_ = 0x3ab743ce;
          auVar336._20_4_ = 0x3ab743ce;
          auVar336._24_4_ = 0x3ab743ce;
          auVar336._28_4_ = 0x3ab743ce;
          auVar70 = vfmadd213ps_fma(auVar235,auVar54,auVar336);
          auVar217._8_4_ = 0x3c088908;
          auVar217._0_8_ = 0x3c0889083c088908;
          auVar217._12_4_ = 0x3c088908;
          auVar217._16_4_ = 0x3c088908;
          auVar217._20_4_ = 0x3c088908;
          auVar217._24_4_ = 0x3c088908;
          auVar217._28_4_ = 0x3c088908;
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar54,auVar217);
          auVar339._8_4_ = 0x3d2aa9c1;
          auVar339._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar339._12_4_ = 0x3d2aa9c1;
          auVar339._16_4_ = 0x3d2aa9c1;
          auVar339._20_4_ = 0x3d2aa9c1;
          auVar339._24_4_ = 0x3d2aa9c1;
          auVar339._28_4_ = 0x3d2aa9c1;
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar54,auVar339);
          auVar260._8_4_ = 0x3e2aaaaa;
          auVar260._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar260._12_4_ = 0x3e2aaaaa;
          auVar260._16_4_ = 0x3e2aaaaa;
          auVar260._20_4_ = 0x3e2aaaaa;
          auVar260._24_4_ = 0x3e2aaaaa;
          auVar260._28_4_ = 0x3e2aaaaa;
          auVar54 = ZEXT1632(auVar110);
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar54,auVar260);
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar54,auVar343);
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar20,auVar54);
          auVar149._0_4_ = auVar70._0_4_ + fVar2;
          auVar149._4_4_ = auVar70._4_4_ + fVar154;
          auVar149._8_4_ = auVar70._8_4_ + fVar11;
          auVar149._12_4_ = auVar70._12_4_ + fVar12;
          auVar149._16_4_ = fVar13 + 0.0;
          auVar149._20_4_ = fVar14 + 0.0;
          auVar149._24_4_ = fVar15 + 0.0;
          auVar149._28_4_ = fVar16 + 0.0;
          auVar70._0_4_ = (int)auVar64._0_4_;
          auVar70._4_4_ = (int)auVar64._4_4_;
          auVar70._8_4_ = (int)auVar64._8_4_;
          auVar70._12_4_ = (int)auVar64._12_4_;
          auVar55._16_4_ = (int)auVar64._16_4_;
          auVar55._0_16_ = auVar70;
          auVar55._20_4_ = (int)auVar64._20_4_;
          auVar55._24_4_ = (int)auVar64._24_4_;
          auVar55._28_4_ = (int)auVar64._28_4_;
          auVar110 = vpslld_avx(auVar70,0x17);
          auVar70 = vpslld_avx(auVar55._16_16_,0x17);
          auVar72._8_4_ = 0x3f800000;
          auVar72._0_8_ = 0x3f8000003f800000;
          auVar72._12_4_ = 0x3f800000;
          auVar70 = vpaddd_avx(auVar72,auVar70);
          auVar110 = vpaddd_avx(auVar72,auVar110);
          auVar56._16_16_ = auVar70;
          auVar56._0_16_ = auVar110;
          auVar113 = vfmadd213ps_fma(auVar56,auVar149,auVar51);
          auVar96._8_4_ = 0x800000;
          auVar96._0_8_ = 0x80000000800000;
          auVar96._12_4_ = 0x800000;
          auVar96._16_4_ = 0x800000;
          auVar96._20_4_ = 0x800000;
          auVar96._24_4_ = 0x800000;
          auVar96._28_4_ = 0x800000;
          auVar64 = vmaxps_avx(ZEXT1632(auVar113),auVar96);
          auVar110 = vpsrld_avx(auVar64._0_16_,0x17);
          auVar70 = vpsrld_avx(auVar64._16_16_,0x17);
          auVar261._8_4_ = 0x807fffff;
          auVar261._0_8_ = 0x807fffff807fffff;
          auVar261._12_4_ = 0x807fffff;
          auVar261._16_4_ = 0x807fffff;
          auVar261._20_4_ = 0x807fffff;
          auVar261._24_4_ = 0x807fffff;
          auVar261._28_4_ = 0x807fffff;
          auVar64 = vandps_avx(auVar261,auVar64);
          auVar63 = vorps_avx(auVar343,auVar64);
          auVar262._8_4_ = 0x3f3504f3;
          auVar262._0_8_ = 0x3f3504f33f3504f3;
          auVar262._12_4_ = 0x3f3504f3;
          auVar262._16_4_ = 0x3f3504f3;
          auVar262._20_4_ = 0x3f3504f3;
          auVar262._24_4_ = 0x3f3504f3;
          auVar262._28_4_ = 0x3f3504f3;
          auVar54 = vcmpps_avx(auVar262,auVar63,2);
          auVar64 = vandnps_avx(auVar54,auVar63);
          auVar218._8_4_ = 0xbf800000;
          auVar218._0_8_ = 0xbf800000bf800000;
          auVar218._12_4_ = 0xbf800000;
          auVar218._16_4_ = 0xbf800000;
          auVar218._20_4_ = 0xbf800000;
          auVar218._24_4_ = 0xbf800000;
          auVar218._28_4_ = 0xbf800000;
          auVar97._0_4_ = auVar64._0_4_ + auVar63._0_4_ + -1.0;
          auVar97._4_4_ = auVar64._4_4_ + auVar63._4_4_ + -1.0;
          auVar97._8_4_ = auVar64._8_4_ + auVar63._8_4_ + -1.0;
          auVar97._12_4_ = auVar64._12_4_ + auVar63._12_4_ + -1.0;
          auVar97._16_4_ = auVar64._16_4_ + auVar63._16_4_ + -1.0;
          auVar97._20_4_ = auVar64._20_4_ + auVar63._20_4_ + -1.0;
          auVar97._24_4_ = auVar64._24_4_ + auVar63._24_4_ + -1.0;
          auVar97._28_4_ = auVar64._28_4_ + auVar63._28_4_ + -1.0;
          auVar70 = vpsubd_avx(auVar70,auVar54._16_16_);
          auVar185._8_4_ = 0xffffff81;
          auVar185._0_8_ = 0xffffff81ffffff81;
          auVar185._12_4_ = 0xffffff81;
          auVar70 = vpaddd_avx(auVar185,auVar70);
          auVar110 = vpsubd_avx(auVar110,auVar54._0_16_);
          auVar110 = vpaddd_avx(auVar185,auVar110);
          auVar150._16_16_ = auVar70;
          auVar150._0_16_ = auVar110;
          auVar200._0_4_ = auVar97._0_4_ * auVar97._0_4_;
          auVar200._4_4_ = auVar97._4_4_ * auVar97._4_4_;
          auVar200._8_4_ = auVar97._8_4_ * auVar97._8_4_;
          auVar200._12_4_ = auVar97._12_4_ * auVar97._12_4_;
          auVar200._16_4_ = auVar97._16_4_ * auVar97._16_4_;
          auVar200._20_4_ = auVar97._20_4_ * auVar97._20_4_;
          auVar200._24_4_ = auVar97._24_4_ * auVar97._24_4_;
          auVar200._28_4_ = 0;
          auVar263._8_4_ = 0x3d9021bb;
          auVar263._0_8_ = 0x3d9021bb3d9021bb;
          auVar263._12_4_ = 0x3d9021bb;
          auVar263._16_4_ = 0x3d9021bb;
          auVar263._20_4_ = 0x3d9021bb;
          auVar263._24_4_ = 0x3d9021bb;
          auVar263._28_4_ = 0x3d9021bb;
          auVar294._8_4_ = 0xbdebd1b8;
          auVar294._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar294._12_4_ = 0xbdebd1b8;
          auVar294._16_4_ = 0xbdebd1b8;
          auVar294._20_4_ = 0xbdebd1b8;
          auVar294._24_4_ = 0xbdebd1b8;
          auVar294._28_4_ = 0xbdebd1b8;
          auVar70 = vfmadd213ps_fma(auVar263,auVar97,auVar294);
          auVar295._8_4_ = 0x3def251a;
          auVar295._0_8_ = 0x3def251a3def251a;
          auVar295._12_4_ = 0x3def251a;
          auVar295._16_4_ = 0x3def251a;
          auVar295._20_4_ = 0x3def251a;
          auVar295._24_4_ = 0x3def251a;
          auVar295._28_4_ = 0x3def251a;
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar97,auVar295);
          auVar296._8_4_ = 0xbdfe5d4f;
          auVar296._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar296._12_4_ = 0xbdfe5d4f;
          auVar296._16_4_ = 0xbdfe5d4f;
          auVar296._20_4_ = 0xbdfe5d4f;
          auVar296._24_4_ = 0xbdfe5d4f;
          auVar296._28_4_ = 0xbdfe5d4f;
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar97,auVar296);
          auVar297._8_4_ = 0x3e11e9bf;
          auVar297._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar297._12_4_ = 0x3e11e9bf;
          auVar297._16_4_ = 0x3e11e9bf;
          auVar297._20_4_ = 0x3e11e9bf;
          auVar297._24_4_ = 0x3e11e9bf;
          auVar297._28_4_ = 0x3e11e9bf;
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar97,auVar297);
          auVar298._8_4_ = 0xbe2aae50;
          auVar298._0_8_ = 0xbe2aae50be2aae50;
          auVar298._12_4_ = 0xbe2aae50;
          auVar298._16_4_ = 0xbe2aae50;
          auVar298._20_4_ = 0xbe2aae50;
          auVar298._24_4_ = 0xbe2aae50;
          auVar298._28_4_ = 0xbe2aae50;
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar97,auVar298);
          auVar299._8_4_ = 0x3e4cceac;
          auVar299._0_8_ = 0x3e4cceac3e4cceac;
          auVar299._12_4_ = 0x3e4cceac;
          auVar299._16_4_ = 0x3e4cceac;
          auVar299._20_4_ = 0x3e4cceac;
          auVar299._24_4_ = 0x3e4cceac;
          auVar299._28_4_ = 0x3e4cceac;
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar97,auVar299);
          auVar300._8_4_ = 0xbe7ffffc;
          auVar300._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar300._12_4_ = 0xbe7ffffc;
          auVar300._16_4_ = 0xbe7ffffc;
          auVar300._20_4_ = 0xbe7ffffc;
          auVar300._24_4_ = 0xbe7ffffc;
          auVar300._28_4_ = 0xbe7ffffc;
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar97,auVar300);
          auVar301._8_4_ = 0x3eaaaaaa;
          auVar301._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar301._12_4_ = 0x3eaaaaaa;
          auVar301._16_4_ = 0x3eaaaaaa;
          auVar301._20_4_ = 0x3eaaaaaa;
          auVar301._24_4_ = 0x3eaaaaaa;
          auVar301._28_4_ = 0x3eaaaaaa;
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar97,auVar301);
          auVar264._0_4_ = auVar200._0_4_ * auVar97._0_4_ * auVar70._0_4_;
          auVar264._4_4_ = auVar200._4_4_ * auVar97._4_4_ * auVar70._4_4_;
          auVar264._8_4_ = auVar200._8_4_ * auVar97._8_4_ * auVar70._8_4_;
          auVar264._12_4_ = auVar200._12_4_ * auVar97._12_4_ * auVar70._12_4_;
          auVar264._16_4_ = auVar200._16_4_ * auVar97._16_4_ * 0.0;
          auVar264._20_4_ = auVar200._20_4_ * auVar97._20_4_ * 0.0;
          auVar264._24_4_ = auVar200._24_4_ * auVar97._24_4_ * 0.0;
          auVar264._28_4_ = 0;
          auVar54 = vcvtdq2ps_avx(auVar150);
          auVar70 = vfmadd231ps_fma(auVar264,auVar54,auVar329);
          auVar70 = vfmsub231ps_fma(ZEXT1632(auVar70),auVar343,auVar200);
          auVar64 = vcmpps_avx(ZEXT1632(auVar113),_DAT_004f0900,2);
          auVar63 = vsubps_avx(ZEXT1632(auVar70),auVar97);
          auVar70 = vfmsub231ps_fma(auVar63,auVar320,auVar54);
          auVar265._8_4_ = 0xc0000000;
          auVar265._0_8_ = 0xc0000000c0000000;
          auVar265._12_4_ = 0xc0000000;
          auVar265._16_4_ = 0xc0000000;
          auVar265._20_4_ = 0xc0000000;
          auVar265._24_4_ = 0xc0000000;
          auVar265._28_4_ = 0xc0000000;
          auVar98._0_4_ = auVar70._0_4_ * -2.0;
          auVar98._4_4_ = auVar70._4_4_ * -2.0;
          auVar98._8_4_ = auVar70._8_4_ * -2.0;
          auVar98._12_4_ = auVar70._12_4_ * -2.0;
          auVar98._16_4_ = 0x80000000;
          auVar98._20_4_ = 0x80000000;
          auVar98._24_4_ = 0x80000000;
          auVar98._28_4_ = 0;
          auVar151._8_4_ = 0x7fffffff;
          auVar151._0_8_ = 0x7fffffff7fffffff;
          auVar151._12_4_ = 0x7fffffff;
          auVar151._16_4_ = 0x7fffffff;
          auVar151._20_4_ = 0x7fffffff;
          auVar151._24_4_ = 0x7fffffff;
          auVar151._28_4_ = 0x7fffffff;
          auVar64 = vblendvps_avx(auVar98,auVar151,auVar64);
          auVar99._8_4_ = 0x42b0c0a5;
          auVar99._0_8_ = 0x42b0c0a542b0c0a5;
          auVar99._12_4_ = 0x42b0c0a5;
          auVar99._16_4_ = 0x42b0c0a5;
          auVar99._20_4_ = 0x42b0c0a5;
          auVar99._24_4_ = 0x42b0c0a5;
          auVar99._28_4_ = 0x42b0c0a5;
          auVar64 = vminps_avx(auVar64,auVar99);
          auVar100._8_4_ = 0xc2b0c0a5;
          auVar100._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar100._12_4_ = 0xc2b0c0a5;
          auVar100._16_4_ = 0xc2b0c0a5;
          auVar100._20_4_ = 0xc2b0c0a5;
          auVar100._24_4_ = 0xc2b0c0a5;
          auVar100._28_4_ = 0xc2b0c0a5;
          auVar54 = vmaxps_avx(auVar64,auVar100);
          auVar101._8_4_ = 0x3fb8aa3b;
          auVar101._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar101._12_4_ = 0x3fb8aa3b;
          auVar101._16_4_ = 0x3fb8aa3b;
          auVar101._20_4_ = 0x3fb8aa3b;
          auVar101._24_4_ = 0x3fb8aa3b;
          auVar101._28_4_ = 0x3fb8aa3b;
          auVar70 = vfmadd213ps_fma(auVar101,auVar54,auVar343);
          auVar63 = vroundps_avx(ZEXT1632(auVar70),1);
          auVar64 = vcmpps_avx(ZEXT1632(auVar70),auVar63,1);
          auVar64 = vandps_avx(auVar64,auVar51);
          auVar64 = vsubps_avx(auVar63,auVar64);
          auVar70 = vfmsub231ps_fma(auVar54,auVar64,auVar320);
          auVar110 = vfnmsub231ps_fma(ZEXT1632(auVar70),auVar64,auVar329);
          auVar54 = ZEXT1632(auVar110);
          auVar21._28_4_ = auVar63._28_4_;
          auVar21._0_28_ =
               ZEXT1628(CONCAT412(auVar110._12_4_ * auVar110._12_4_,
                                  CONCAT48(auVar110._8_4_ * auVar110._8_4_,
                                           CONCAT44(auVar110._4_4_ * auVar110._4_4_,
                                                    auVar110._0_4_ * auVar110._0_4_))));
          auVar220 = ZEXT3264(auVar51);
          auVar70 = vfmadd213ps_fma(auVar235,auVar54,auVar336);
          auVar344 = ZEXT864(0) << 0x20;
          auVar177._8_4_ = 0x3c088908;
          auVar177._0_8_ = 0x3c0889083c088908;
          auVar177._12_4_ = 0x3c088908;
          auVar177._16_4_ = 0x3c088908;
          auVar177._20_4_ = 0x3c088908;
          auVar177._24_4_ = 0x3c088908;
          auVar177._28_4_ = 0x3c088908;
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar54,auVar177);
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar54,auVar339);
          auVar178._8_4_ = 0x3e2aaaaa;
          auVar178._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar178._12_4_ = 0x3e2aaaaa;
          auVar178._16_4_ = 0x3e2aaaaa;
          auVar178._20_4_ = 0x3e2aaaaa;
          auVar178._24_4_ = 0x3e2aaaaa;
          auVar178._28_4_ = 0x3e2aaaaa;
          auVar54 = ZEXT1632(auVar110);
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar54,auVar178);
          auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar54,auVar343);
          auVar113 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar21,auVar54);
          auVar110._0_4_ = (int)auVar64._0_4_;
          auVar110._4_4_ = (int)auVar64._4_4_;
          auVar110._8_4_ = (int)auVar64._8_4_;
          auVar110._12_4_ = (int)auVar64._12_4_;
          auVar57._16_4_ = (int)auVar64._16_4_;
          auVar57._0_16_ = auVar110;
          auVar57._20_4_ = (int)auVar64._20_4_;
          auVar57._24_4_ = (int)auVar64._24_4_;
          auVar57._28_4_ = (int)auVar64._28_4_;
          auVar110 = vpslld_avx(auVar110,0x17);
          auVar70 = vpslld_avx(auVar57._16_16_,0x17);
          auVar70 = vpaddd_avx(auVar72,auVar70);
          auVar110 = vpaddd_avx(auVar72,auVar110);
          auVar58._16_16_ = auVar70;
          auVar58._0_16_ = auVar110;
          auVar102._0_4_ = auVar113._0_4_ + fVar2;
          auVar102._4_4_ = auVar113._4_4_ + fVar154;
          auVar102._8_4_ = auVar113._8_4_ + fVar11;
          auVar102._12_4_ = auVar113._12_4_ + fVar12;
          auVar102._16_4_ = fVar13 + 0.0;
          auVar102._20_4_ = fVar14 + 0.0;
          auVar102._24_4_ = fVar15 + 0.0;
          auVar102._28_4_ = fVar16 + 0.0;
          auVar70 = vfmadd213ps_fma(auVar58,auVar102,auVar51);
          auVar64 = vrcpps_avx(ZEXT1632(auVar70));
          auVar70 = vfmsub213ps_fma(ZEXT1632(auVar70),auVar64,auVar51);
          auVar70 = vfnmadd132ps_fma(ZEXT1632(auVar70),auVar64,auVar64);
          auVar70 = vfnmadd213ps_fma(ZEXT1632(auVar70),auVar265,auVar218);
          auVar65 = ZEXT1664(auVar70);
          goto LAB_002a8fd3;
        case 6:
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
          auVar63._4_4_ = uVar1;
          auVar63._0_4_ = uVar1;
          auVar63._8_4_ = uVar1;
          auVar63._12_4_ = uVar1;
          auVar63._16_4_ = uVar1;
          auVar63._20_4_ = uVar1;
          auVar63._24_4_ = uVar1;
          auVar63._28_4_ = uVar1;
          uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var4))[1];
          auVar108._4_4_ = uVar1;
          auVar108._0_4_ = uVar1;
          auVar108._8_4_ = uVar1;
          auVar108._12_4_ = uVar1;
          auVar108._16_4_ = uVar1;
          auVar108._20_4_ = uVar1;
          auVar108._24_4_ = uVar1;
          auVar108._28_4_ = uVar1;
          auVar70 = vfmadd231ps_fma(auVar108,auVar244,auVar63);
          auVar64 = vmaxps_avx(auVar54,ZEXT1632(auVar70));
          auVar64 = vminps_avx(auVar64,auVar51);
          auVar65 = ZEXT3264(auVar64);
LAB_002a8fd3:
          auVar66._0_4_ = auVar65._0_4_ * fVar42;
          auVar66._4_4_ = auVar65._4_4_ * fVar67;
          auVar66._8_4_ = auVar65._8_4_ * auVar244._8_4_;
          auVar66._12_4_ = auVar65._12_4_ * auVar244._12_4_;
          auVar66._16_4_ = auVar65._16_4_ * auVar244._16_4_;
          auVar66._20_4_ = auVar65._20_4_ * auVar244._20_4_;
          auVar66._28_36_ = auVar65._28_36_;
          auVar66._24_4_ = auVar65._24_4_ * auVar244._24_4_;
          auVar64 = auVar66._0_32_;
        }
switchD_002a8b8b_caseD_1:
        *(undefined1 (*) [32])((long)top_blob->data + uVar27 * 0x20) = auVar64;
        uVar30 = uVar30 + local_90;
        lVar33 = lVar33 + local_90;
        lVar34 = lVar34 + local_90;
        lVar36 = lVar36 + local_90;
        lVar41 = lVar41 + local_90;
        lVar38 = lVar38 + local_90;
        local_110 = local_110 + local_90;
        local_150 = local_150 + local_90;
      }
      uVar30 = (long)(int)uVar3 & 0xfffffffffffffff8;
      uVar26 = uVar3 >> 2 & 1;
      lVar38 = lVar31 * uVar30 * 4;
      lVar34 = lVar31 * 0x10;
      lVar36 = (uVar30 + 1) * lVar31 * 4;
      lVar33 = (uVar30 + 2) * lVar31 * 4;
      lVar41 = (uVar30 + 3) * lVar31 * 4;
      auVar220 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar113._8_4_ = 0x3ab743ce;
      auVar113._0_8_ = 0x3ab743ce3ab743ce;
      auVar113._12_4_ = 0x3ab743ce;
      for (uVar27 = 0; uVar27 != uVar26; uVar27 = uVar27 + 1) {
        lVar37 = uVar30 + uVar27 * 4;
        if (lVar6 == 0) {
          auVar70 = ZEXT816(0) << 0x40;
        }
        else {
          auVar70 = *(undefined1 (*) [16])(lVar6 + lVar37 * 4);
        }
        pvVar7 = (this->weight_data_tm).data;
        lVar39 = 0;
        auVar110 = ZEXT816(0) << 0x40;
        lVar40 = 0;
        auVar185 = ZEXT816(0) << 0x40;
        auVar72 = ZEXT816(0) << 0x40;
        auVar48 = ZEXT816(0) << 0x40;
        iVar35 = 0;
        while( true ) {
          if (iVar32 <= iVar35 + 7) break;
          auVar64 = *(undefined1 (*) [32])((undefined1 *)local_d8._0_8_ + lVar40);
          auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar64,
                                     *(undefined1 (*) [32])((long)pvVar7 + lVar40 + lVar38));
          auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar64,
                                     *(undefined1 (*) [32])((long)pvVar7 + lVar40 + lVar36));
          auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar64,
                                    *(undefined1 (*) [32])((long)pvVar7 + lVar40 + lVar33));
          auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar64,
                                    *(undefined1 (*) [32])((long)pvVar7 + lVar40 + lVar41));
          iVar35 = iVar35 + 8;
          lVar40 = lVar40 + 0x20;
          lVar39 = lVar39 + 8;
        }
        auVar68 = ZEXT816(0) << 0x40;
        auVar82 = ZEXT816(0) << 0x40;
        auVar122 = ZEXT816(0) << 0x40;
        auVar81 = ZEXT816(0) << 0x40;
        for (; iVar35 + 3 < iVar32; iVar35 = iVar35 + 4) {
          auVar131 = *(undefined1 (*) [16])((undefined1 *)local_d8._0_8_ + lVar40);
          auVar68 = vfmadd231ps_fma(auVar68,auVar131,
                                    *(undefined1 (*) [16])((long)pvVar7 + lVar40 + lVar38));
          auVar82 = vfmadd231ps_fma(auVar82,auVar131,
                                    *(undefined1 (*) [16])((long)pvVar7 + lVar40 + lVar36));
          auVar122 = vfmadd231ps_fma(auVar122,auVar131,
                                     *(undefined1 (*) [16])((long)pvVar7 + lVar40 + lVar33));
          auVar81 = vfmadd231ps_fma(auVar81,auVar131,
                                    *(undefined1 (*) [16])((long)pvVar7 + lVar40 + lVar41));
          lVar40 = lVar40 + 0x10;
          lVar39 = lVar39 + 4;
        }
        for (; (int)lVar39 < iVar32; lVar39 = lVar39 + 1) {
          auVar131 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar7 + lVar39 * 4 + lVar38)),
                                   ZEXT416(*(uint *)((long)pvVar7 + lVar39 * 4 + lVar36)),0x10);
          auVar131 = vinsertps_avx(auVar131,ZEXT416(*(uint *)((long)pvVar7 + lVar39 * 4 + lVar33)),
                                   0x20);
          auVar131 = vinsertps_avx(auVar131,ZEXT416(*(uint *)((long)pvVar7 + lVar39 * 4 + lVar41)),
                                   0x30);
          uVar1 = *(undefined4 *)((undefined1 *)local_d8._0_8_ + lVar39 * 4);
          auVar311._4_4_ = uVar1;
          auVar311._0_4_ = uVar1;
          auVar311._8_4_ = uVar1;
          auVar311._12_4_ = uVar1;
          auVar70 = vfmadd231ps_fma(auVar70,auVar131,auVar311);
        }
        auVar64 = vhaddps_avx(ZEXT1632(auVar110),ZEXT1632(auVar185));
        auVar343 = vhaddps_avx(ZEXT1632(auVar72),ZEXT1632(auVar48));
        auVar64 = vhaddps_avx(auVar64,auVar343);
        auVar185 = vunpcklps_avx(auVar68,auVar82);
        auVar72 = vunpcklps_avx(auVar122,auVar81);
        auVar48 = vunpckhps_avx(auVar68,auVar82);
        auVar68 = vunpckhps_avx(auVar122,auVar81);
        auVar110 = vmovlhps_avx(auVar185,auVar72);
        auVar72 = vunpckhpd_avx(auVar185,auVar72);
        auVar185 = vmovlhps_avx(auVar48,auVar68);
        auVar48 = vunpckhpd_avx(auVar48,auVar68);
        auVar122._0_4_ =
             auVar64._16_4_ +
             auVar70._0_4_ + auVar72._0_4_ + auVar110._0_4_ + auVar185._0_4_ + auVar48._0_4_ +
             auVar64._0_4_;
        auVar122._4_4_ =
             auVar64._20_4_ +
             auVar70._4_4_ + auVar72._4_4_ + auVar110._4_4_ + auVar185._4_4_ + auVar48._4_4_ +
             auVar64._4_4_;
        auVar122._8_4_ =
             auVar64._24_4_ +
             auVar70._8_4_ + auVar72._8_4_ + auVar110._8_4_ + auVar185._8_4_ + auVar48._8_4_ +
             auVar64._8_4_;
        auVar122._12_4_ =
             auVar64._28_4_ +
             auVar70._12_4_ + auVar72._12_4_ + auVar110._12_4_ + auVar185._12_4_ + auVar48._12_4_ +
             auVar64._12_4_;
        auVar82 = auVar122;
        if (iVar25 - 1U < 6) {
          auVar70 = SUB6416(ZEXT864(0),0);
          auVar82 = vmaxps_avx(auVar122,auVar70);
          auVar110 = auVar220._0_16_;
          switch(iVar25) {
          case 2:
            auVar70 = vminps_avx(auVar122,auVar70);
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
            auVar203._4_4_ = uVar1;
            auVar203._0_4_ = uVar1;
            auVar203._8_4_ = uVar1;
            auVar203._12_4_ = uVar1;
            auVar82 = vfmadd231ps_fma(auVar82,auVar70,auVar203);
            break;
          case 3:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
            auVar78._4_4_ = uVar1;
            auVar78._0_4_ = uVar1;
            auVar78._8_4_ = uVar1;
            auVar78._12_4_ = uVar1;
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var4))[1];
            auVar127._4_4_ = uVar1;
            auVar127._0_4_ = uVar1;
            auVar127._8_4_ = uVar1;
            auVar127._12_4_ = uVar1;
            auVar70 = vmaxps_avx(auVar122,auVar78);
            auVar82 = vminps_avx(auVar70,auVar127);
            break;
          case 4:
            uVar23 = CONCAT44(auVar122._4_4_,auVar122._0_4_);
            auVar79._0_8_ = uVar23 ^ 0x8000000080000000;
            auVar79._8_4_ = -auVar122._8_4_;
            auVar79._12_4_ = -auVar122._12_4_;
            auVar128._8_4_ = 0x42b0c0a5;
            auVar128._0_8_ = 0x42b0c0a542b0c0a5;
            auVar128._12_4_ = 0x42b0c0a5;
            auVar70 = vminps_avx(auVar79,auVar128);
            auVar129._8_4_ = 0xc2b0c0a5;
            auVar129._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar129._12_4_ = 0xc2b0c0a5;
            auVar72 = vmaxps_avx(auVar70,auVar129);
            auVar130._8_4_ = 0x3fb8aa3b;
            auVar130._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar130._12_4_ = 0x3fb8aa3b;
            auVar70 = vfmadd213ps_fma(auVar130,auVar72,auVar110);
            auVar212._0_4_ = (int)auVar70._0_4_;
            auVar212._4_4_ = (int)auVar70._4_4_;
            auVar212._8_4_ = (int)auVar70._8_4_;
            auVar212._12_4_ = (int)auVar70._12_4_;
            auVar185 = vcvtdq2ps_avx(auVar212);
            auVar70 = vcmpps_avx(auVar70,auVar185,1);
            auVar255._8_4_ = 0x3f800000;
            auVar255._0_8_ = 0x3f8000003f800000;
            auVar255._12_4_ = 0x3f800000;
            auVar70 = vandps_avx(auVar255,auVar70);
            auVar70 = vsubps_avx(auVar185,auVar70);
            auVar170._8_4_ = 0x3f318000;
            auVar170._0_8_ = 0x3f3180003f318000;
            auVar170._12_4_ = 0x3f318000;
            auVar185 = vfmsub231ps_fma(auVar72,auVar70,auVar170);
            auVar213._8_4_ = 0x395e8083;
            auVar213._0_8_ = 0x395e8083395e8083;
            auVar213._12_4_ = 0x395e8083;
            auVar72 = vfmsub231ps_fma(auVar185,auVar70,auVar213);
            auVar214._0_4_ = auVar72._0_4_ * auVar72._0_4_;
            auVar214._4_4_ = auVar72._4_4_ * auVar72._4_4_;
            auVar214._8_4_ = auVar72._8_4_ * auVar72._8_4_;
            auVar214._12_4_ = auVar72._12_4_ * auVar72._12_4_;
            auVar226._8_4_ = 0x39506967;
            auVar226._0_8_ = 0x3950696739506967;
            auVar226._12_4_ = 0x39506967;
            auVar279._8_4_ = 0x3ab743ce;
            auVar279._0_8_ = 0x3ab743ce3ab743ce;
            auVar279._12_4_ = 0x3ab743ce;
            auVar185 = vfmadd213ps_fma(auVar226,auVar72,auVar279);
            auVar242._8_4_ = 0x3c088908;
            auVar242._0_8_ = 0x3c0889083c088908;
            auVar242._12_4_ = 0x3c088908;
            auVar185 = vfmadd213ps_fma(auVar185,auVar72,auVar242);
            auVar171._8_4_ = 0x3d2aa9c1;
            auVar171._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar171._12_4_ = 0x3d2aa9c1;
            auVar185 = vfmadd213ps_fma(auVar185,auVar72,auVar171);
            auVar172._8_4_ = 0x3e2aaaaa;
            auVar172._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar172._12_4_ = 0x3e2aaaaa;
            auVar185 = vfmadd213ps_fma(auVar185,auVar72,auVar172);
            auVar110 = vfmadd213ps_fma(auVar185,auVar72,auVar110);
            auVar110 = vfmadd213ps_fma(auVar110,auVar214,auVar72);
            auVar215._0_4_ = auVar110._0_4_ + 1.0;
            auVar215._4_4_ = auVar110._4_4_ + 1.0;
            auVar215._8_4_ = auVar110._8_4_ + 1.0;
            auVar215._12_4_ = auVar110._12_4_ + 1.0;
            auVar80._0_4_ = (int)auVar70._0_4_;
            auVar80._4_4_ = (int)auVar70._4_4_;
            auVar80._8_4_ = (int)auVar70._8_4_;
            auVar80._12_4_ = (int)auVar70._12_4_;
            auVar70 = vpslld_avx(auVar80,0x17);
            auVar70 = vpaddd_avx(auVar255,auVar70);
            auVar110 = vfmadd213ps_fma(auVar70,auVar215,auVar255);
            auVar70 = vrcpps_avx(auVar110);
            auVar110 = vfmsub213ps_fma(auVar110,auVar70,auVar255);
            auVar82 = vfnmadd132ps_fma(auVar110,auVar70,auVar70);
            break;
          case 5:
            auVar322._8_4_ = 0x42b0c0a5;
            auVar322._0_8_ = 0x42b0c0a542b0c0a5;
            auVar322._12_4_ = 0x42b0c0a5;
            auVar70 = vminps_avx(auVar122,auVar322);
            auVar331._8_4_ = 0xc2b0c0a5;
            auVar331._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar331._12_4_ = 0xc2b0c0a5;
            auVar72 = vmaxps_avx(auVar331,auVar70);
            auVar341._8_4_ = 0x3fb8aa3b;
            auVar341._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar341._12_4_ = 0x3fb8aa3b;
            auVar70 = vfmadd213ps_fma(auVar341,auVar72,auVar110);
            auVar204._0_4_ = (int)auVar70._0_4_;
            auVar204._4_4_ = (int)auVar70._4_4_;
            auVar204._8_4_ = (int)auVar70._8_4_;
            auVar204._12_4_ = (int)auVar70._12_4_;
            auVar185 = vcvtdq2ps_avx(auVar204);
            auVar70 = vcmpps_avx(auVar70,auVar185,1);
            auVar312._8_4_ = 0x3f800000;
            auVar312._0_8_ = 0x3f8000003f800000;
            auVar312._12_4_ = 0x3f800000;
            auVar70 = vandps_avx(auVar312,auVar70);
            auVar70 = vsubps_avx(auVar185,auVar70);
            auVar166._8_4_ = 0x3f318000;
            auVar166._0_8_ = 0x3f3180003f318000;
            auVar166._12_4_ = 0x3f318000;
            auVar185 = vfmsub231ps_fma(auVar72,auVar70,auVar166);
            auVar323._8_4_ = 0xb95e8083;
            auVar323._0_8_ = 0xb95e8083b95e8083;
            auVar323._12_4_ = 0xb95e8083;
            auVar72 = vfnmsub231ps_fma(auVar185,auVar70,auVar323);
            auVar205._0_4_ = auVar72._0_4_ * auVar72._0_4_;
            auVar205._4_4_ = auVar72._4_4_ * auVar72._4_4_;
            auVar205._8_4_ = auVar72._8_4_ * auVar72._8_4_;
            auVar205._12_4_ = auVar72._12_4_ * auVar72._12_4_;
            auVar192._8_4_ = 0x39506967;
            auVar192._0_8_ = 0x3950696739506967;
            auVar192._12_4_ = 0x39506967;
            auVar185 = vfmadd213ps_fma(auVar192,auVar72,auVar113);
            auVar240._8_4_ = 0x3c088908;
            auVar240._0_8_ = 0x3c0889083c088908;
            auVar240._12_4_ = 0x3c088908;
            auVar185 = vfmadd213ps_fma(auVar185,auVar72,auVar240);
            auVar241._8_4_ = 0x3d2aa9c1;
            auVar241._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar241._12_4_ = 0x3d2aa9c1;
            auVar185 = vfmadd213ps_fma(auVar185,auVar72,auVar241);
            auVar252._8_4_ = 0x3e2aaaaa;
            auVar252._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar252._12_4_ = 0x3e2aaaaa;
            auVar185 = vfmadd213ps_fma(auVar185,auVar72,auVar252);
            auVar185 = vfmadd213ps_fma(auVar185,auVar72,auVar110);
            auVar185 = vfmadd213ps_fma(auVar185,auVar205,auVar72);
            auVar206._0_4_ = auVar185._0_4_ + 1.0;
            auVar206._4_4_ = auVar185._4_4_ + 1.0;
            auVar206._8_4_ = auVar185._8_4_ + 1.0;
            auVar206._12_4_ = auVar185._12_4_ + 1.0;
            auVar76._0_4_ = (int)auVar70._0_4_;
            auVar76._4_4_ = (int)auVar70._4_4_;
            auVar76._8_4_ = (int)auVar70._8_4_;
            auVar76._12_4_ = (int)auVar70._12_4_;
            auVar70 = vpslld_avx(auVar76,0x17);
            auVar70 = vpaddd_avx(auVar312,auVar70);
            auVar68 = vfmadd213ps_fma(auVar70,auVar206,auVar312);
            auVar123._8_4_ = 0x800000;
            auVar123._0_8_ = 0x80000000800000;
            auVar123._12_4_ = 0x800000;
            auVar70 = vmaxps_avx(auVar68,auVar123);
            auVar185 = vpsrld_avx(auVar70,0x17);
            auVar222._8_4_ = 0xffffff82;
            auVar222._0_8_ = 0xffffff82ffffff82;
            auVar222._12_4_ = 0xffffff82;
            auVar185 = vpaddd_avx(auVar185,auVar222);
            auVar223._8_4_ = 0x807fffff;
            auVar223._0_8_ = 0x807fffff807fffff;
            auVar223._12_4_ = 0x807fffff;
            auVar70 = vandps_avx(auVar70,auVar223);
            auVar48 = vorps_avx(auVar70,auVar110);
            auVar72 = vcvtdq2ps_avx(auVar185);
            auVar224._8_4_ = 0x3f3504f3;
            auVar224._0_8_ = 0x3f3504f33f3504f3;
            auVar224._12_4_ = 0x3f3504f3;
            auVar185 = vcmpps_avx(auVar48,auVar224,1);
            auVar70 = vandps_avx(auVar185,auVar48);
            auVar124._0_4_ = auVar70._0_4_ + auVar48._0_4_ + -1.0;
            auVar124._4_4_ = auVar70._4_4_ + auVar48._4_4_ + -1.0;
            auVar124._8_4_ = auVar70._8_4_ + auVar48._8_4_ + -1.0;
            auVar124._12_4_ = auVar70._12_4_ + auVar48._12_4_ + -1.0;
            auVar70 = vandps_avx(auVar312,auVar185);
            auVar185 = vsubps_avx(auVar72,auVar70);
            auVar225._0_4_ = auVar124._0_4_ * auVar124._0_4_;
            auVar225._4_4_ = auVar124._4_4_ * auVar124._4_4_;
            auVar225._8_4_ = auVar124._8_4_ * auVar124._8_4_;
            auVar225._12_4_ = auVar124._12_4_ * auVar124._12_4_;
            auVar253._8_4_ = 0x3d9021bb;
            auVar253._0_8_ = 0x3d9021bb3d9021bb;
            auVar253._12_4_ = 0x3d9021bb;
            auVar271._8_4_ = 0xbdebd1b8;
            auVar271._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar271._12_4_ = 0xbdebd1b8;
            auVar70 = vfmadd213ps_fma(auVar253,auVar124,auVar271);
            auVar272._8_4_ = 0x3def251a;
            auVar272._0_8_ = 0x3def251a3def251a;
            auVar272._12_4_ = 0x3def251a;
            auVar70 = vfmadd213ps_fma(auVar70,auVar124,auVar272);
            auVar273._8_4_ = 0xbdfe5d4f;
            auVar273._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar273._12_4_ = 0xbdfe5d4f;
            auVar70 = vfmadd213ps_fma(auVar70,auVar124,auVar273);
            auVar274._8_4_ = 0x3e11e9bf;
            auVar274._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar274._12_4_ = 0x3e11e9bf;
            auVar70 = vfmadd213ps_fma(auVar70,auVar124,auVar274);
            auVar275._8_4_ = 0xbe2aae50;
            auVar275._0_8_ = 0xbe2aae50be2aae50;
            auVar275._12_4_ = 0xbe2aae50;
            auVar70 = vfmadd213ps_fma(auVar70,auVar124,auVar275);
            auVar276._8_4_ = 0x3e4cceac;
            auVar276._0_8_ = 0x3e4cceac3e4cceac;
            auVar276._12_4_ = 0x3e4cceac;
            auVar70 = vfmadd213ps_fma(auVar70,auVar124,auVar276);
            auVar277._8_4_ = 0xbe7ffffc;
            auVar277._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar277._12_4_ = 0xbe7ffffc;
            auVar70 = vfmadd213ps_fma(auVar70,auVar124,auVar277);
            auVar278._8_4_ = 0x3eaaaaaa;
            auVar278._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar278._12_4_ = 0x3eaaaaaa;
            auVar70 = vfmadd213ps_fma(auVar70,auVar124,auVar278);
            auVar254._0_4_ = auVar225._0_4_ * auVar124._0_4_ * auVar70._0_4_;
            auVar254._4_4_ = auVar225._4_4_ * auVar124._4_4_ * auVar70._4_4_;
            auVar254._8_4_ = auVar225._8_4_ * auVar124._8_4_ * auVar70._8_4_;
            auVar254._12_4_ = auVar225._12_4_ * auVar124._12_4_ * auVar70._12_4_;
            auVar70 = vfmadd231ps_fma(auVar254,auVar185,auVar323);
            auVar72 = vfmsub231ps_fma(auVar70,auVar110,auVar225);
            auVar70 = vcmpps_avx(auVar68,_DAT_004ec4d0,2);
            auVar72 = vsubps_avx(auVar72,auVar124);
            auVar185 = vfnmadd231ps_fma(auVar72,auVar166,auVar185);
            auVar125._0_4_ = auVar185._0_4_ + auVar185._0_4_;
            auVar125._4_4_ = auVar185._4_4_ + auVar185._4_4_;
            auVar125._8_4_ = auVar185._8_4_ + auVar185._8_4_;
            auVar125._12_4_ = auVar185._12_4_ + auVar185._12_4_;
            auVar207._8_4_ = 0x7fffffff;
            auVar207._0_8_ = 0x7fffffff7fffffff;
            auVar207._12_4_ = 0x7fffffff;
            auVar70 = vblendvps_avx(auVar125,auVar207,auVar70);
            auVar126._8_4_ = 0x42b0c0a5;
            auVar126._0_8_ = 0x42b0c0a542b0c0a5;
            auVar126._12_4_ = 0x42b0c0a5;
            auVar70 = vminps_avx(auVar70,auVar126);
            auVar72 = vmaxps_avx(auVar331,auVar70);
            auVar70 = vfmadd213ps_fma(auVar341,auVar72,auVar110);
            auVar208._0_4_ = (int)auVar70._0_4_;
            auVar208._4_4_ = (int)auVar70._4_4_;
            auVar208._8_4_ = (int)auVar70._8_4_;
            auVar208._12_4_ = (int)auVar70._12_4_;
            auVar185 = vcvtdq2ps_avx(auVar208);
            auVar70 = vcmpps_avx(auVar70,auVar185,1);
            auVar70 = vandps_avx(auVar312,auVar70);
            auVar70 = vsubps_avx(auVar185,auVar70);
            auVar185 = vfmsub231ps_fma(auVar72,auVar70,auVar166);
            auVar72 = vfnmsub231ps_fma(auVar185,auVar70,auVar323);
            auVar209._0_4_ = auVar72._0_4_ * auVar72._0_4_;
            auVar209._4_4_ = auVar72._4_4_ * auVar72._4_4_;
            auVar209._8_4_ = auVar72._8_4_ * auVar72._8_4_;
            auVar209._12_4_ = auVar72._12_4_ * auVar72._12_4_;
            auVar220 = ZEXT1664(auVar110);
            auVar185 = vfmadd213ps_fma(auVar192,auVar72,auVar113);
            auVar167._8_4_ = 0x3c088908;
            auVar167._0_8_ = 0x3c0889083c088908;
            auVar167._12_4_ = 0x3c088908;
            auVar185 = vfmadd213ps_fma(auVar185,auVar72,auVar167);
            auVar185 = vfmadd213ps_fma(auVar185,auVar72,auVar241);
            auVar168._8_4_ = 0x3e2aaaaa;
            auVar168._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar168._12_4_ = 0x3e2aaaaa;
            auVar185 = vfmadd213ps_fma(auVar185,auVar72,auVar168);
            auVar110 = vfmadd213ps_fma(auVar185,auVar72,auVar110);
            auVar110 = vfmadd213ps_fma(auVar110,auVar209,auVar72);
            auVar210._0_4_ = auVar110._0_4_ + 1.0;
            auVar210._4_4_ = auVar110._4_4_ + 1.0;
            auVar210._8_4_ = auVar110._8_4_ + 1.0;
            auVar210._12_4_ = auVar110._12_4_ + 1.0;
            auVar77._0_4_ = (int)auVar70._0_4_;
            auVar77._4_4_ = (int)auVar70._4_4_;
            auVar77._8_4_ = (int)auVar70._8_4_;
            auVar77._12_4_ = (int)auVar70._12_4_;
            auVar70 = vpslld_avx(auVar77,0x17);
            auVar70 = vpaddd_avx(auVar312,auVar70);
            auVar110 = vfmadd213ps_fma(auVar70,auVar210,auVar312);
            auVar70 = vrcpps_avx(auVar110);
            auVar211._0_4_ = auVar70._0_4_ + auVar70._0_4_;
            auVar211._4_4_ = auVar70._4_4_ + auVar70._4_4_;
            auVar211._8_4_ = auVar70._8_4_ + auVar70._8_4_;
            auVar211._12_4_ = auVar70._12_4_ + auVar70._12_4_;
            auVar169._8_4_ = 0x40000000;
            auVar169._0_8_ = 0x4000000040000000;
            auVar169._12_4_ = 0x40000000;
            auVar110 = vfmsub213ps_fma(auVar110,auVar211,auVar169);
            auVar70 = vfnmadd213ps_fma(auVar110,auVar70,auVar211);
            auVar82 = vfmsub213ps_fma(auVar70,auVar122,auVar122);
            break;
          case 6:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
            auVar81._4_4_ = uVar1;
            auVar81._0_4_ = uVar1;
            auVar81._8_4_ = uVar1;
            auVar81._12_4_ = uVar1;
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var4))[1];
            auVar131._4_4_ = uVar1;
            auVar131._0_4_ = uVar1;
            auVar131._8_4_ = uVar1;
            auVar131._12_4_ = uVar1;
            auVar110 = vfmadd231ps_fma(auVar131,auVar122,auVar81);
            auVar70 = vmaxps_avx(auVar110,auVar70);
            auVar132._8_4_ = 0x3f800000;
            auVar132._0_8_ = 0x3f8000003f800000;
            auVar132._12_4_ = 0x3f800000;
            auVar70 = vminps_avx(auVar70,auVar132);
            auVar82._0_4_ = auVar122._0_4_ * auVar70._0_4_;
            auVar82._4_4_ = auVar122._4_4_ * auVar70._4_4_;
            auVar82._8_4_ = auVar122._8_4_ * auVar70._8_4_;
            auVar82._12_4_ = auVar122._12_4_ * auVar70._12_4_;
          }
        }
        *(undefined1 (*) [16])((long)top_blob->data + lVar37 * 4) = auVar82;
        lVar38 = lVar38 + lVar34;
        lVar36 = lVar36 + lVar34;
        lVar33 = lVar33 + lVar34;
        lVar41 = lVar41 + lVar34;
      }
      pvVar7 = (this->weight_data_tm).data;
      pfVar9 = *(float **)(&this->field_0xe8 + (long)p_Var4);
      pvVar10 = top_blob->data;
      local_140 = 0;
      for (lVar33 = (long)(int)((int)uVar30 + uVar26 * 4); lVar33 < (int)uVar3; lVar33 = lVar33 + 1)
      {
        if (lVar6 == 0) {
          auVar220 = ZEXT1664(ZEXT816(0) << 0x40);
        }
        else {
          auVar220 = ZEXT464(*(uint *)(lVar6 + lVar33 * 4));
        }
        pauVar28 = (undefined1 (*) [32])((long)pvVar7 + lVar33 * lVar31 * 4);
        auVar70 = ZEXT816(0) << 0x40;
        pauVar29 = (undefined1 (*) [32])uVar24;
        for (iVar35 = 0; iVar35 + 7 < iVar32; iVar35 = iVar35 + 8) {
          auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),*pauVar29,*pauVar28);
          pauVar29 = pauVar29 + 1;
          pauVar28 = pauVar28 + 1;
        }
        auVar110 = ZEXT816(0) << 0x40;
        for (; iVar35 + 3 < iVar32; iVar35 = iVar35 + 4) {
          auVar110 = vfmadd231ps_fma(auVar110,*(undefined1 (*) [16])*pauVar29,
                                     *(undefined1 (*) [16])*pauVar28);
          pauVar29 = (undefined1 (*) [32])(*pauVar29 + 0x10);
          pauVar28 = (undefined1 (*) [32])(*pauVar28 + 0x10);
        }
        lVar34 = 0;
        for (; iVar35 < iVar32; iVar35 = iVar35 + 1) {
          auVar113 = vfmadd231ss_fma(auVar220._0_16_,ZEXT416(*(uint *)(*pauVar28 + lVar34)),
                                     ZEXT416(*(uint *)(*pauVar29 + lVar34)));
          auVar220 = ZEXT1664(auVar113);
          lVar34 = lVar34 + 4;
        }
        auVar83._0_4_ = auVar70._0_4_ + auVar110._0_4_ + 0.0;
        auVar83._4_4_ = auVar70._4_4_ + auVar110._4_4_ + 0.0;
        auVar83._8_4_ = auVar70._8_4_ + auVar110._8_4_ + 0.0;
        auVar83._12_4_ = auVar70._12_4_ + auVar110._12_4_ + 0.0;
        auVar70 = vhaddps_avx(auVar83,auVar83);
        auVar70 = vhaddps_avx(auVar70,auVar70);
        fVar42 = auVar70._0_4_ + auVar220._0_4_;
        auVar70 = ZEXT416((uint)fVar42);
        fVar67 = fVar42;
        switch(iVar25) {
        case 1:
          auVar70 = vmaxss_avx(auVar70,ZEXT416(0));
          fVar67 = auVar70._0_4_;
          break;
        case 2:
          auVar70 = vcmpss_avx(ZEXT816(0) << 0x40,auVar70,1);
          auVar134._8_4_ = 0x3f800000;
          auVar134._0_8_ = 0x3f8000003f800000;
          auVar134._12_4_ = 0x3f800000;
          auVar70 = vblendvps_avx(ZEXT416((uint)*pfVar9),auVar134,auVar70);
          fVar67 = auVar70._0_4_ * fVar42;
          break;
        case 3:
          auVar70 = vmaxss_avx(auVar70,ZEXT416((uint)*pfVar9));
          fVar67 = auVar70._0_4_;
          if (pfVar9[1] < auVar70._0_4_) {
            fVar67 = pfVar9[1];
          }
          break;
        case 4:
          auVar70 = vminss_avx(auVar70,ZEXT416(0x42b0c0a5));
          auVar84._0_8_ = auVar70._0_8_ ^ 0x8000000080000000;
          auVar84._8_4_ = auVar70._8_4_ ^ 0x80000000;
          auVar84._12_4_ = auVar70._12_4_ ^ 0x80000000;
          auVar70 = vcmpss_avx(auVar70,ZEXT416(0xc2b0c0a5),1);
          auVar133._8_4_ = 0x42b0c0a5;
          auVar133._0_8_ = 0x42b0c0a542b0c0a5;
          auVar133._12_4_ = 0x42b0c0a5;
          auVar70 = vblendvps_avx(auVar84,auVar133,auVar70);
          fVar42 = expf(auVar70._0_4_);
          fVar67 = 1.0 / (fVar42 + 1.0);
          break;
        case 5:
          fVar67 = expf(fVar42);
          fVar67 = logf(fVar67 + 1.0);
          fVar67 = tanhf(fVar67);
          fVar67 = fVar67 * fVar42;
          break;
        case 6:
          fVar2 = *pfVar9;
          fVar154 = -pfVar9[1] / fVar2;
          fVar67 = 0.0;
          if ((fVar154 <= fVar42) && (fVar67 = fVar42, fVar42 <= fVar154 + 1.0 / fVar2)) {
            auVar70 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar70,ZEXT416((uint)pfVar9[1]));
            fVar67 = auVar70._0_4_ * fVar42;
          }
        }
        *(float *)((long)pvVar10 + lVar33 * 4) = fVar67;
      }
    }
    else if (iVar35 == 4) {
      local_140 = 0;
      uVar30 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar30 = 0;
      }
      auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar220 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar344 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      auVar337._8_4_ = 0x3ab743ce;
      auVar337._0_8_ = 0x3ab743ce3ab743ce;
      auVar337._12_4_ = 0x3ab743ce;
      for (uVar27 = 0; uVar27 != uVar30; uVar27 = uVar27 + 1) {
        if (lVar6 == 0) {
          auVar70 = ZEXT816(0) << 0x40;
        }
        else {
          auVar70 = *(undefined1 (*) [16])(lVar6 + uVar27 * 0x10);
        }
        pvVar7 = (this->weight_data_tm).data;
        sVar8 = (this->weight_data_tm).elemsize;
        lVar31 = (long)(this->weight_data_tm).w;
        pauVar29 = (undefined1 (*) [32])(uVar27 * lVar31 * sVar8 + (long)pvVar7);
        lVar33 = 0;
        auVar72 = ZEXT816(0) << 0x40;
        lVar34 = 0;
        auVar185 = ZEXT816(0) << 0x40;
        auVar113 = ZEXT816(0) << 0x40;
        auVar110 = ZEXT816(0) << 0x40;
        pauVar28 = (undefined1 (*) [32])local_d8._0_8_;
        for (iVar35 = 0; iVar35 + 7 < iVar32; iVar35 = iVar35 + 8) {
          uVar1 = *(undefined4 *)*pauVar28;
          auVar197._4_4_ = uVar1;
          auVar197._0_4_ = uVar1;
          auVar197._8_4_ = uVar1;
          auVar197._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(*pauVar28 + 4);
          auVar197._20_4_ = uVar1;
          auVar197._16_4_ = uVar1;
          auVar197._24_4_ = uVar1;
          auVar197._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(*pauVar28 + 8);
          auVar292._4_4_ = uVar1;
          auVar292._0_4_ = uVar1;
          auVar292._8_4_ = uVar1;
          auVar292._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(*pauVar28 + 0xc);
          auVar292._20_4_ = uVar1;
          auVar292._16_4_ = uVar1;
          auVar292._24_4_ = uVar1;
          auVar292._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(*pauVar28 + 0x10);
          auVar318._4_4_ = uVar1;
          auVar318._0_4_ = uVar1;
          auVar318._8_4_ = uVar1;
          auVar318._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(*pauVar28 + 0x14);
          auVar318._20_4_ = uVar1;
          auVar318._16_4_ = uVar1;
          auVar318._24_4_ = uVar1;
          auVar318._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(*pauVar28 + 0x18);
          auVar198._4_4_ = uVar1;
          auVar198._0_4_ = uVar1;
          auVar198._8_4_ = uVar1;
          auVar198._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(*pauVar28 + 0x1c);
          auVar198._20_4_ = uVar1;
          auVar198._16_4_ = uVar1;
          auVar198._24_4_ = uVar1;
          auVar198._28_4_ = uVar1;
          auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar197,*pauVar29);
          auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar292,pauVar29[1]);
          auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar318,pauVar29[2]);
          auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar198,pauVar29[3]);
          pauVar28 = pauVar28 + 1;
          pauVar29 = pauVar29 + 4;
          lVar34 = lVar34 + 0x20;
          lVar33 = lVar33 + 8;
        }
        lVar31 = sVar8 * uVar27 * lVar31;
        for (; iVar35 + 3 < iVar32; iVar35 = iVar35 + 4) {
          uVar1 = *(undefined4 *)((undefined1 *)local_d8._0_8_ + lVar34 + 4);
          auVar199._20_4_ = uVar1;
          auVar199._16_4_ = uVar1;
          auVar199._24_4_ = uVar1;
          auVar199._28_4_ = uVar1;
          uVar1 = *(undefined4 *)((undefined1 *)local_d8._0_8_ + lVar34);
          auVar199._4_4_ = uVar1;
          auVar199._0_4_ = uVar1;
          auVar199._8_4_ = uVar1;
          auVar199._12_4_ = uVar1;
          uVar1 = *(undefined4 *)((undefined1 *)local_d8._0_8_ + lVar34 + 0xc);
          auVar293._20_4_ = uVar1;
          auVar293._16_4_ = uVar1;
          auVar293._24_4_ = uVar1;
          auVar293._28_4_ = uVar1;
          uVar1 = *(undefined4 *)((undefined1 *)local_d8._0_8_ + lVar34 + 8);
          auVar293._4_4_ = uVar1;
          auVar293._0_4_ = uVar1;
          auVar293._8_4_ = uVar1;
          auVar293._12_4_ = uVar1;
          auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar199,
                                     *(undefined1 (*) [32])((long)pvVar7 + lVar34 * 4 + lVar31));
          auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar293,
                                     *(undefined1 (*) [32])
                                      ((long)pvVar7 + lVar34 * 4 + lVar31 + 0x20));
          pauVar29 = pauVar29 + 2;
          lVar34 = lVar34 + 0x10;
          lVar33 = lVar33 + 4;
        }
        for (; (int)lVar33 < iVar32; lVar33 = lVar33 + 1) {
          uVar1 = *(undefined4 *)((undefined1 *)local_d8._0_8_ + lVar33 * 4);
          auVar181._4_4_ = uVar1;
          auVar181._0_4_ = uVar1;
          auVar181._8_4_ = uVar1;
          auVar181._12_4_ = uVar1;
          auVar70 = vfmadd231ps_fma(auVar70,auVar181,*(undefined1 (*) [16])*pauVar29);
          pauVar29 = (undefined1 (*) [32])(*pauVar29 + 0x10);
        }
        auVar73._0_4_ =
             auVar70._0_4_ + auVar185._0_4_ + auVar72._0_4_ + auVar113._0_4_ + auVar110._0_4_ + 0.0;
        auVar73._4_4_ =
             auVar70._4_4_ + auVar185._4_4_ + auVar72._4_4_ + auVar113._4_4_ + auVar110._4_4_ + 0.0;
        auVar73._8_4_ =
             auVar70._8_4_ + auVar185._8_4_ + auVar72._8_4_ + auVar113._8_4_ + auVar110._8_4_ + 0.0;
        auVar73._12_4_ =
             auVar70._12_4_ + auVar185._12_4_ + auVar72._12_4_ + auVar113._12_4_ + auVar110._12_4_ +
             0.0;
        auVar121 = auVar73;
        if (iVar25 - 1U < 6) {
          auVar113 = auVar65._0_16_;
          auVar121 = vmaxps_avx(auVar113,auVar73);
          auVar110 = auVar344._0_16_;
          auVar70 = auVar220._0_16_;
          fVar42 = auVar344._0_4_;
          fVar67 = auVar344._4_4_;
          fVar2 = auVar344._8_4_;
          fVar154 = auVar344._12_4_;
          switch(iVar25) {
          case 2:
            auVar70 = vminps_avx(auVar113,auVar73);
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
            auVar155._4_4_ = uVar1;
            auVar155._0_4_ = uVar1;
            auVar155._8_4_ = uVar1;
            auVar155._12_4_ = uVar1;
            auVar121 = vfmadd231ps_fma(auVar121,auVar70,auVar155);
            break;
          case 3:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
            auVar115._4_4_ = uVar1;
            auVar115._0_4_ = uVar1;
            auVar115._8_4_ = uVar1;
            auVar115._12_4_ = uVar1;
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var4))[1];
            auVar160._4_4_ = uVar1;
            auVar160._0_4_ = uVar1;
            auVar160._8_4_ = uVar1;
            auVar160._12_4_ = uVar1;
            auVar70 = vmaxps_avx(auVar73,auVar115);
            auVar121 = vminps_avx(auVar70,auVar160);
            break;
          case 4:
            uVar23 = CONCAT44(auVar73._4_4_,auVar73._0_4_);
            auVar74._0_8_ = uVar23 ^ 0x8000000080000000;
            auVar74._8_4_ = -auVar73._8_4_;
            auVar74._12_4_ = -auVar73._12_4_;
            auVar116._8_4_ = 0x42b0c0a5;
            auVar116._0_8_ = 0x42b0c0a542b0c0a5;
            auVar116._12_4_ = 0x42b0c0a5;
            auVar113 = vminps_avx(auVar74,auVar116);
            auVar117._8_4_ = 0xc2b0c0a5;
            auVar117._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar117._12_4_ = 0xc2b0c0a5;
            auVar72 = vmaxps_avx(auVar113,auVar117);
            auVar118._8_4_ = 0x3fb8aa3b;
            auVar118._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar118._12_4_ = 0x3fb8aa3b;
            auVar113 = vfmadd213ps_fma(auVar118,auVar72,auVar70);
            auVar161._0_4_ = (int)auVar113._0_4_;
            auVar161._4_4_ = (int)auVar113._4_4_;
            auVar161._8_4_ = (int)auVar113._8_4_;
            auVar161._12_4_ = (int)auVar113._12_4_;
            auVar185 = vcvtdq2ps_avx(auVar161);
            auVar113 = vcmpps_avx(auVar113,auVar185,1);
            auVar113 = vandps_avx(auVar113,auVar110);
            auVar113 = vsubps_avx(auVar185,auVar113);
            auVar162._8_4_ = 0x3f318000;
            auVar162._0_8_ = 0x3f3180003f318000;
            auVar162._12_4_ = 0x3f318000;
            auVar185 = vfmsub231ps_fma(auVar72,auVar113,auVar162);
            auVar163._8_4_ = 0x395e8083;
            auVar163._0_8_ = 0x395e8083395e8083;
            auVar163._12_4_ = 0x395e8083;
            auVar72 = vfmsub231ps_fma(auVar185,auVar113,auVar163);
            auVar164._0_4_ = auVar72._0_4_ * auVar72._0_4_;
            auVar164._4_4_ = auVar72._4_4_ * auVar72._4_4_;
            auVar164._8_4_ = auVar72._8_4_ * auVar72._8_4_;
            auVar164._12_4_ = auVar72._12_4_ * auVar72._12_4_;
            auVar191._8_4_ = 0x39506967;
            auVar191._0_8_ = 0x3950696739506967;
            auVar191._12_4_ = 0x39506967;
            auVar250._8_4_ = 0x3ab743ce;
            auVar250._0_8_ = 0x3ab743ce3ab743ce;
            auVar250._12_4_ = 0x3ab743ce;
            auVar185 = vfmadd213ps_fma(auVar191,auVar72,auVar250);
            auVar251._8_4_ = 0x3c088908;
            auVar251._0_8_ = 0x3c0889083c088908;
            auVar251._12_4_ = 0x3c088908;
            auVar185 = vfmadd213ps_fma(auVar185,auVar72,auVar251);
            auVar238._8_4_ = 0x3d2aa9c1;
            auVar238._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar238._12_4_ = 0x3d2aa9c1;
            auVar185 = vfmadd213ps_fma(auVar185,auVar72,auVar238);
            auVar239._8_4_ = 0x3e2aaaaa;
            auVar239._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar239._12_4_ = 0x3e2aaaaa;
            auVar185 = vfmadd213ps_fma(auVar185,auVar72,auVar239);
            auVar70 = vfmadd213ps_fma(auVar185,auVar72,auVar70);
            auVar70 = vfmadd213ps_fma(auVar70,auVar164,auVar72);
            auVar75._0_4_ = auVar70._0_4_ + fVar42;
            auVar75._4_4_ = auVar70._4_4_ + fVar67;
            auVar75._8_4_ = auVar70._8_4_ + fVar2;
            auVar75._12_4_ = auVar70._12_4_ + fVar154;
            auVar119._0_4_ = (int)auVar113._0_4_;
            auVar119._4_4_ = (int)auVar113._4_4_;
            auVar119._8_4_ = (int)auVar113._8_4_;
            auVar119._12_4_ = (int)auVar113._12_4_;
            auVar70 = vpslld_avx(auVar119,0x17);
            auVar70 = vpaddd_avx(auVar70,auVar110);
            auVar113 = vfmadd213ps_fma(auVar70,auVar75,auVar110);
            auVar70 = vrcpps_avx(auVar113);
            auVar110 = vfmsub213ps_fma(auVar113,auVar70,auVar110);
            auVar121 = vfnmadd132ps_fma(auVar110,auVar70,auVar70);
            break;
          case 5:
            auVar321._8_4_ = 0x42b0c0a5;
            auVar321._0_8_ = 0x42b0c0a542b0c0a5;
            auVar321._12_4_ = 0x42b0c0a5;
            auVar113 = vminps_avx(auVar321,auVar73);
            auVar330._8_4_ = 0xc2b0c0a5;
            auVar330._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar330._12_4_ = 0xc2b0c0a5;
            auVar72 = vmaxps_avx(auVar330,auVar113);
            auVar340._8_4_ = 0x3fb8aa3b;
            auVar340._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar340._12_4_ = 0x3fb8aa3b;
            auVar113 = vfmadd213ps_fma(auVar340,auVar72,auVar70);
            auVar182._0_4_ = (int)auVar113._0_4_;
            auVar182._4_4_ = (int)auVar113._4_4_;
            auVar182._8_4_ = (int)auVar113._8_4_;
            auVar182._12_4_ = (int)auVar113._12_4_;
            auVar185 = vcvtdq2ps_avx(auVar182);
            auVar113 = vcmpps_avx(auVar113,auVar185,1);
            auVar113 = vandps_avx(auVar113,auVar110);
            auVar113 = vsubps_avx(auVar185,auVar113);
            auVar202._8_4_ = 0x3f318000;
            auVar202._0_8_ = 0x3f3180003f318000;
            auVar202._12_4_ = 0x3f318000;
            auVar185 = vfmsub231ps_fma(auVar72,auVar113,auVar202);
            auVar221._8_4_ = 0xb95e8083;
            auVar221._0_8_ = 0xb95e8083b95e8083;
            auVar221._12_4_ = 0xb95e8083;
            auVar72 = vfnmsub231ps_fma(auVar185,auVar113,auVar221);
            auVar183._0_4_ = auVar72._0_4_ * auVar72._0_4_;
            auVar183._4_4_ = auVar72._4_4_ * auVar72._4_4_;
            auVar183._8_4_ = auVar72._8_4_ * auVar72._8_4_;
            auVar183._12_4_ = auVar72._12_4_ * auVar72._12_4_;
            auVar237._8_4_ = 0x39506967;
            auVar237._0_8_ = 0x3950696739506967;
            auVar237._12_4_ = 0x39506967;
            auVar185 = vfmadd213ps_fma(auVar237,auVar72,auVar337);
            auVar302._8_4_ = 0x3c088908;
            auVar302._0_8_ = 0x3c0889083c088908;
            auVar302._12_4_ = 0x3c088908;
            auVar185 = vfmadd213ps_fma(auVar185,auVar72,auVar302);
            auVar267._8_4_ = 0x3d2aa9c1;
            auVar267._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar267._12_4_ = 0x3d2aa9c1;
            auVar185 = vfmadd213ps_fma(auVar185,auVar72,auVar267);
            auVar268._8_4_ = 0x3e2aaaaa;
            auVar268._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar268._12_4_ = 0x3e2aaaaa;
            auVar185 = vfmadd213ps_fma(auVar185,auVar72,auVar268);
            auVar185 = vfmadd213ps_fma(auVar185,auVar72,auVar70);
            auVar185 = vfmadd213ps_fma(auVar185,auVar183,auVar72);
            auVar184._0_4_ = auVar185._0_4_ + fVar42;
            auVar184._4_4_ = auVar185._4_4_ + fVar67;
            auVar184._8_4_ = auVar185._8_4_ + fVar2;
            auVar184._12_4_ = auVar185._12_4_ + fVar154;
            auVar112._0_4_ = (int)auVar113._0_4_;
            auVar112._4_4_ = (int)auVar113._4_4_;
            auVar112._8_4_ = (int)auVar113._8_4_;
            auVar112._12_4_ = (int)auVar113._12_4_;
            auVar113 = vpslld_avx(auVar112,0x17);
            auVar113 = vpaddd_avx(auVar113,auVar110);
            auVar68 = vfmadd213ps_fma(auVar113,auVar184,auVar110);
            auVar156._8_4_ = 0x800000;
            auVar156._0_8_ = 0x80000000800000;
            auVar156._12_4_ = 0x800000;
            auVar113 = vmaxps_avx(auVar68,auVar156);
            auVar185 = vpsrld_avx(auVar113,0x17);
            auVar246._8_4_ = 0xffffff82;
            auVar246._0_8_ = 0xffffff82ffffff82;
            auVar246._12_4_ = 0xffffff82;
            auVar185 = vpaddd_avx(auVar246,auVar185);
            auVar247._8_4_ = 0x807fffff;
            auVar247._0_8_ = 0x807fffff807fffff;
            auVar247._12_4_ = 0x807fffff;
            auVar113 = vandps_avx(auVar247,auVar113);
            auVar48 = vorps_avx(auVar70,auVar113);
            auVar72 = vcvtdq2ps_avx(auVar185);
            auVar248._8_4_ = 0x3f3504f3;
            auVar248._0_8_ = 0x3f3504f33f3504f3;
            auVar248._12_4_ = 0x3f3504f3;
            auVar185 = vcmpps_avx(auVar48,auVar248,1);
            auVar113 = vandps_avx(auVar185,auVar48);
            auVar157._0_4_ = auVar113._0_4_ + auVar48._0_4_ + -1.0;
            auVar157._4_4_ = auVar113._4_4_ + auVar48._4_4_ + -1.0;
            auVar157._8_4_ = auVar113._8_4_ + auVar48._8_4_ + -1.0;
            auVar157._12_4_ = auVar113._12_4_ + auVar48._12_4_ + -1.0;
            auVar113 = vandps_avx(auVar185,auVar110);
            auVar185 = vsubps_avx(auVar72,auVar113);
            auVar249._0_4_ = auVar157._0_4_ * auVar157._0_4_;
            auVar249._4_4_ = auVar157._4_4_ * auVar157._4_4_;
            auVar249._8_4_ = auVar157._8_4_ * auVar157._8_4_;
            auVar249._12_4_ = auVar157._12_4_ * auVar157._12_4_;
            auVar269._8_4_ = 0x3d9021bb;
            auVar269._0_8_ = 0x3d9021bb3d9021bb;
            auVar269._12_4_ = 0x3d9021bb;
            auVar303._8_4_ = 0xbdebd1b8;
            auVar303._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar303._12_4_ = 0xbdebd1b8;
            auVar113 = vfmadd213ps_fma(auVar269,auVar157,auVar303);
            auVar304._8_4_ = 0x3def251a;
            auVar304._0_8_ = 0x3def251a3def251a;
            auVar304._12_4_ = 0x3def251a;
            auVar113 = vfmadd213ps_fma(auVar113,auVar157,auVar304);
            auVar305._8_4_ = 0xbdfe5d4f;
            auVar305._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar305._12_4_ = 0xbdfe5d4f;
            auVar113 = vfmadd213ps_fma(auVar113,auVar157,auVar305);
            auVar306._8_4_ = 0x3e11e9bf;
            auVar306._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar306._12_4_ = 0x3e11e9bf;
            auVar113 = vfmadd213ps_fma(auVar113,auVar157,auVar306);
            auVar307._8_4_ = 0xbe2aae50;
            auVar307._0_8_ = 0xbe2aae50be2aae50;
            auVar307._12_4_ = 0xbe2aae50;
            auVar113 = vfmadd213ps_fma(auVar113,auVar157,auVar307);
            auVar308._8_4_ = 0x3e4cceac;
            auVar308._0_8_ = 0x3e4cceac3e4cceac;
            auVar308._12_4_ = 0x3e4cceac;
            auVar113 = vfmadd213ps_fma(auVar113,auVar157,auVar308);
            auVar309._8_4_ = 0xbe7ffffc;
            auVar309._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar309._12_4_ = 0xbe7ffffc;
            auVar113 = vfmadd213ps_fma(auVar113,auVar157,auVar309);
            auVar310._8_4_ = 0x3eaaaaaa;
            auVar310._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar310._12_4_ = 0x3eaaaaaa;
            auVar113 = vfmadd213ps_fma(auVar113,auVar157,auVar310);
            auVar270._0_4_ = auVar249._0_4_ * auVar157._0_4_ * auVar113._0_4_;
            auVar270._4_4_ = auVar249._4_4_ * auVar157._4_4_ * auVar113._4_4_;
            auVar270._8_4_ = auVar249._8_4_ * auVar157._8_4_ * auVar113._8_4_;
            auVar270._12_4_ = auVar249._12_4_ * auVar157._12_4_ * auVar113._12_4_;
            auVar113 = vfmadd231ps_fma(auVar270,auVar185,auVar221);
            auVar72 = vfmsub231ps_fma(auVar113,auVar70,auVar249);
            auVar113 = vcmpps_avx(auVar68,_DAT_004ec4d0,2);
            auVar72 = vsubps_avx(auVar72,auVar157);
            auVar185 = vfnmadd231ps_fma(auVar72,auVar202,auVar185);
            auVar158._0_4_ = auVar185._0_4_ + auVar185._0_4_;
            auVar158._4_4_ = auVar185._4_4_ + auVar185._4_4_;
            auVar158._8_4_ = auVar185._8_4_ + auVar185._8_4_;
            auVar158._12_4_ = auVar185._12_4_ + auVar185._12_4_;
            auVar186._8_4_ = 0x7fffffff;
            auVar186._0_8_ = 0x7fffffff7fffffff;
            auVar186._12_4_ = 0x7fffffff;
            auVar113 = vblendvps_avx(auVar158,auVar186,auVar113);
            auVar159._8_4_ = 0x42b0c0a5;
            auVar159._0_8_ = 0x42b0c0a542b0c0a5;
            auVar159._12_4_ = 0x42b0c0a5;
            auVar113 = vminps_avx(auVar113,auVar159);
            auVar72 = vmaxps_avx(auVar330,auVar113);
            auVar113 = vfmadd213ps_fma(auVar340,auVar72,auVar70);
            auVar187._0_4_ = (int)auVar113._0_4_;
            auVar187._4_4_ = (int)auVar113._4_4_;
            auVar187._8_4_ = (int)auVar113._8_4_;
            auVar187._12_4_ = (int)auVar113._12_4_;
            auVar185 = vcvtdq2ps_avx(auVar187);
            auVar113 = vcmpps_avx(auVar113,auVar185,1);
            auVar113 = vandps_avx(auVar113,auVar110);
            auVar113 = vsubps_avx(auVar185,auVar113);
            auVar185 = vfmsub231ps_fma(auVar72,auVar113,auVar202);
            auVar220 = ZEXT1664(auVar70);
            auVar65 = ZEXT864(0);
            auVar72 = vfnmsub231ps_fma(auVar185,auVar113,auVar221);
            auVar344 = ZEXT1664(auVar110);
            auVar188._0_4_ = auVar72._0_4_ * auVar72._0_4_;
            auVar188._4_4_ = auVar72._4_4_ * auVar72._4_4_;
            auVar188._8_4_ = auVar72._8_4_ * auVar72._8_4_;
            auVar188._12_4_ = auVar72._12_4_ * auVar72._12_4_;
            auVar185 = vfmadd213ps_fma(auVar237,auVar72,auVar337);
            auVar44._8_4_ = 0x3c088908;
            auVar44._0_8_ = 0x3c0889083c088908;
            auVar44._12_4_ = 0x3c088908;
            auVar185 = vfmadd213ps_fma(auVar185,auVar72,auVar44);
            auVar45._8_4_ = 0x3d2aa9c1;
            auVar45._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar45._12_4_ = 0x3d2aa9c1;
            auVar185 = vfmadd213ps_fma(auVar185,auVar72,auVar45);
            auVar46._8_4_ = 0x3e2aaaaa;
            auVar46._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar46._12_4_ = 0x3e2aaaaa;
            auVar185 = vfmadd213ps_fma(auVar185,auVar72,auVar46);
            auVar70 = vfmadd213ps_fma(auVar185,auVar72,auVar70);
            auVar70 = vfmadd213ps_fma(auVar70,auVar188,auVar72);
            auVar189._0_4_ = auVar70._0_4_ + fVar42;
            auVar189._4_4_ = auVar70._4_4_ + fVar67;
            auVar189._8_4_ = auVar70._8_4_ + fVar2;
            auVar189._12_4_ = auVar70._12_4_ + fVar154;
            auVar114._0_4_ = (int)auVar113._0_4_;
            auVar114._4_4_ = (int)auVar113._4_4_;
            auVar114._8_4_ = (int)auVar113._8_4_;
            auVar114._12_4_ = (int)auVar113._12_4_;
            auVar70 = vpslld_avx(auVar114,0x17);
            auVar70 = vpaddd_avx(auVar70,auVar110);
            auVar110 = vfmadd213ps_fma(auVar70,auVar189,auVar110);
            auVar70 = vrcpps_avx(auVar110);
            auVar190._0_4_ = auVar70._0_4_ + auVar70._0_4_;
            auVar190._4_4_ = auVar70._4_4_ + auVar70._4_4_;
            auVar190._8_4_ = auVar70._8_4_ + auVar70._8_4_;
            auVar190._12_4_ = auVar70._12_4_ + auVar70._12_4_;
            auVar47._8_4_ = 0x40000000;
            auVar47._0_8_ = 0x4000000040000000;
            auVar47._12_4_ = 0x40000000;
            auVar110 = vfmsub213ps_fma(auVar110,auVar190,auVar47);
            auVar70 = vfnmadd213ps_fma(auVar110,auVar70,auVar190);
            auVar121 = vfmsub213ps_fma(auVar70,auVar73,auVar73);
            break;
          case 6:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
            auVar120._4_4_ = uVar1;
            auVar120._0_4_ = uVar1;
            auVar120._8_4_ = uVar1;
            auVar120._12_4_ = uVar1;
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var4))[1];
            auVar165._4_4_ = uVar1;
            auVar165._0_4_ = uVar1;
            auVar165._8_4_ = uVar1;
            auVar165._12_4_ = uVar1;
            auVar70 = vfmadd231ps_fma(auVar165,auVar73,auVar120);
            auVar70 = vmaxps_avx(auVar113,auVar70);
            auVar70 = vminps_avx(auVar70,auVar110);
            auVar121._0_4_ = auVar70._0_4_ * auVar73._0_4_;
            auVar121._4_4_ = auVar70._4_4_ * auVar73._4_4_;
            auVar121._8_4_ = auVar70._8_4_ * auVar73._8_4_;
            auVar121._12_4_ = auVar70._12_4_ * auVar73._12_4_;
          }
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar27 * 0x10) = auVar121;
      }
    }
    else {
      local_140 = 0;
      if (iVar35 == 8) {
        local_140 = 0;
        uVar30 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar30 = 0;
        }
        auVar220 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar344 = ZEXT1664(ZEXT816(0) << 0x40);
        for (uVar27 = 0; uVar27 != uVar30; uVar27 = uVar27 + 1) {
          auVar70 = ZEXT816(0) << 0x40;
          auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
          if (lVar6 != 0) {
            auVar65 = ZEXT3264(*(undefined1 (*) [32])(lVar6 + uVar27 * 0x20));
          }
          pvVar7 = (this->weight_data_tm).data;
          sVar8 = (this->weight_data_tm).elemsize;
          lVar31 = (long)(this->weight_data_tm).w;
          pauVar29 = (undefined1 (*) [32])(uVar27 * lVar31 * sVar8 + (long)pvVar7);
          lVar33 = 0;
          lVar34 = 0;
          auVar68 = ZEXT816(0) << 0x40;
          auVar48 = ZEXT816(0) << 0x40;
          auVar72 = ZEXT816(0) << 0x40;
          auVar185 = ZEXT816(0) << 0x40;
          auVar113 = ZEXT816(0) << 0x40;
          auVar110 = ZEXT816(0) << 0x40;
          iVar35 = 0;
          pauVar28 = (undefined1 (*) [32])local_d8._0_8_;
          while( true ) {
            if (iVar32 <= iVar35 + 7) break;
            uVar1 = *(undefined4 *)*pauVar28;
            auVar324._4_4_ = uVar1;
            auVar324._0_4_ = uVar1;
            auVar324._8_4_ = uVar1;
            auVar324._12_4_ = uVar1;
            auVar324._16_4_ = uVar1;
            auVar324._20_4_ = uVar1;
            auVar324._24_4_ = uVar1;
            auVar324._28_4_ = uVar1;
            uVar1 = *(undefined4 *)(*pauVar28 + 4);
            auVar280._4_4_ = uVar1;
            auVar280._0_4_ = uVar1;
            auVar280._8_4_ = uVar1;
            auVar280._12_4_ = uVar1;
            auVar280._16_4_ = uVar1;
            auVar280._20_4_ = uVar1;
            auVar280._24_4_ = uVar1;
            auVar280._28_4_ = uVar1;
            uVar1 = *(undefined4 *)(*pauVar28 + 8);
            auVar332._4_4_ = uVar1;
            auVar332._0_4_ = uVar1;
            auVar332._8_4_ = uVar1;
            auVar332._12_4_ = uVar1;
            auVar332._16_4_ = uVar1;
            auVar332._20_4_ = uVar1;
            auVar332._24_4_ = uVar1;
            auVar332._28_4_ = uVar1;
            uVar1 = *(undefined4 *)(*pauVar28 + 0xc);
            auVar227._4_4_ = uVar1;
            auVar227._0_4_ = uVar1;
            auVar227._8_4_ = uVar1;
            auVar227._12_4_ = uVar1;
            auVar227._16_4_ = uVar1;
            auVar227._20_4_ = uVar1;
            auVar227._24_4_ = uVar1;
            auVar227._28_4_ = uVar1;
            auVar82 = vfmadd231ps_fma(auVar65._0_32_,auVar324,*pauVar29);
            auVar65 = ZEXT1664(auVar82);
            auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar280,pauVar29[1]);
            auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar332,pauVar29[2]);
            auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar227,pauVar29[3]);
            uVar1 = *(undefined4 *)(*pauVar28 + 0x10);
            auVar228._4_4_ = uVar1;
            auVar228._0_4_ = uVar1;
            auVar228._8_4_ = uVar1;
            auVar228._12_4_ = uVar1;
            auVar228._16_4_ = uVar1;
            auVar228._20_4_ = uVar1;
            auVar228._24_4_ = uVar1;
            auVar228._28_4_ = uVar1;
            uVar1 = *(undefined4 *)(*pauVar28 + 0x14);
            auVar281._4_4_ = uVar1;
            auVar281._0_4_ = uVar1;
            auVar281._8_4_ = uVar1;
            auVar281._12_4_ = uVar1;
            auVar281._16_4_ = uVar1;
            auVar281._20_4_ = uVar1;
            auVar281._24_4_ = uVar1;
            auVar281._28_4_ = uVar1;
            uVar1 = *(undefined4 *)(*pauVar28 + 0x18);
            auVar325._4_4_ = uVar1;
            auVar325._0_4_ = uVar1;
            auVar325._8_4_ = uVar1;
            auVar325._12_4_ = uVar1;
            auVar325._16_4_ = uVar1;
            auVar325._20_4_ = uVar1;
            auVar325._24_4_ = uVar1;
            auVar325._28_4_ = uVar1;
            uVar1 = *(undefined4 *)(*pauVar28 + 0x1c);
            auVar333._4_4_ = uVar1;
            auVar333._0_4_ = uVar1;
            auVar333._8_4_ = uVar1;
            auVar333._12_4_ = uVar1;
            auVar333._16_4_ = uVar1;
            auVar333._20_4_ = uVar1;
            auVar333._24_4_ = uVar1;
            auVar333._28_4_ = uVar1;
            auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar228,pauVar29[4]);
            auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar281,pauVar29[5]);
            auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar325,pauVar29[6]);
            auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar333,pauVar29[7]);
            pauVar28 = pauVar28 + 1;
            pauVar29 = pauVar29 + 8;
            iVar35 = iVar35 + 8;
            lVar34 = lVar34 + 0x20;
            lVar33 = lVar33 + 8;
          }
          lVar31 = sVar8 * uVar27 * lVar31;
          for (; iVar35 + 3 < iVar32; iVar35 = iVar35 + 4) {
            uVar1 = *(undefined4 *)((undefined1 *)local_d8._0_8_ + lVar34);
            auVar229._4_4_ = uVar1;
            auVar229._0_4_ = uVar1;
            auVar229._8_4_ = uVar1;
            auVar229._12_4_ = uVar1;
            auVar229._16_4_ = uVar1;
            auVar229._20_4_ = uVar1;
            auVar229._24_4_ = uVar1;
            auVar229._28_4_ = uVar1;
            uVar1 = *(undefined4 *)((undefined1 *)local_d8._0_8_ + lVar34 + 4);
            auVar282._4_4_ = uVar1;
            auVar282._0_4_ = uVar1;
            auVar282._8_4_ = uVar1;
            auVar282._12_4_ = uVar1;
            auVar282._16_4_ = uVar1;
            auVar282._20_4_ = uVar1;
            auVar282._24_4_ = uVar1;
            auVar282._28_4_ = uVar1;
            uVar1 = *(undefined4 *)((undefined1 *)local_d8._0_8_ + lVar34 + 8);
            auVar326._4_4_ = uVar1;
            auVar326._0_4_ = uVar1;
            auVar326._8_4_ = uVar1;
            auVar326._12_4_ = uVar1;
            auVar326._16_4_ = uVar1;
            auVar326._20_4_ = uVar1;
            auVar326._24_4_ = uVar1;
            auVar326._28_4_ = uVar1;
            uVar1 = *(undefined4 *)((undefined1 *)local_d8._0_8_ + lVar34 + 0xc);
            auVar334._4_4_ = uVar1;
            auVar334._0_4_ = uVar1;
            auVar334._8_4_ = uVar1;
            auVar334._12_4_ = uVar1;
            auVar334._16_4_ = uVar1;
            auVar334._20_4_ = uVar1;
            auVar334._24_4_ = uVar1;
            auVar334._28_4_ = uVar1;
            auVar82 = vfmadd231ps_fma(auVar65._0_32_,auVar229,
                                      *(undefined1 (*) [32])((long)pvVar7 + lVar34 * 8 + lVar31));
            auVar65 = ZEXT1664(auVar82);
            auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar282,
                                       *(undefined1 (*) [32])
                                        ((long)pvVar7 + lVar34 * 8 + lVar31 + 0x20));
            auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar326,
                                       *(undefined1 (*) [32])
                                        ((long)pvVar7 + lVar34 * 8 + lVar31 + 0x40));
            auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar334,
                                       *(undefined1 (*) [32])
                                        ((long)pvVar7 + lVar34 * 8 + lVar31 + 0x60));
            pauVar29 = pauVar29 + 4;
            lVar34 = lVar34 + 0x10;
            lVar33 = lVar33 + 4;
          }
          for (; (int)lVar33 < iVar32; lVar33 = lVar33 + 1) {
            uVar1 = *(undefined4 *)((undefined1 *)local_d8._0_8_ + lVar33 * 4);
            auVar230._4_4_ = uVar1;
            auVar230._0_4_ = uVar1;
            auVar230._8_4_ = uVar1;
            auVar230._12_4_ = uVar1;
            auVar230._16_4_ = uVar1;
            auVar230._20_4_ = uVar1;
            auVar230._24_4_ = uVar1;
            auVar230._28_4_ = uVar1;
            auVar82 = vfmadd231ps_fma(auVar65._0_32_,auVar230,*pauVar29);
            auVar65 = ZEXT1664(auVar82);
            pauVar29 = pauVar29 + 1;
          }
          fVar42 = auVar70._0_4_ + auVar68._0_4_ + auVar48._0_4_ + auVar72._0_4_ +
                   auVar110._0_4_ + auVar185._0_4_ + auVar113._0_4_ + auVar65._0_4_;
          fVar67 = auVar70._4_4_ + auVar68._4_4_ + auVar48._4_4_ + auVar72._4_4_ +
                   auVar110._4_4_ + auVar185._4_4_ + auVar113._4_4_ + auVar65._4_4_;
          auVar49._0_8_ = CONCAT44(fVar67,fVar42);
          auVar49._8_4_ =
               auVar70._8_4_ + auVar68._8_4_ + auVar48._8_4_ + auVar72._8_4_ +
               auVar110._8_4_ + auVar185._8_4_ + auVar113._8_4_ + auVar65._8_4_;
          auVar49._12_4_ =
               auVar70._12_4_ + auVar68._12_4_ + auVar48._12_4_ + auVar72._12_4_ +
               auVar110._12_4_ + auVar185._12_4_ + auVar113._12_4_ + auVar65._12_4_;
          auVar49._16_4_ = auVar65._16_4_ + 0.0;
          auVar49._20_4_ = auVar65._20_4_ + 0.0;
          auVar49._24_4_ = auVar65._24_4_ + 0.0;
          auVar49._28_4_ = auVar65._28_4_ + 0.0;
          auVar64 = auVar49;
          if (5 < iVar25 - 1U) goto switchD_002a7ef5_caseD_1;
          auVar51 = auVar344._0_32_;
          auVar64 = vmaxps_avx(auVar51,auVar49);
          auVar343 = auVar220._0_32_;
          fVar2 = auVar220._0_4_;
          fVar154 = auVar220._4_4_;
          fVar11 = auVar220._8_4_;
          fVar12 = auVar220._12_4_;
          fVar13 = auVar220._16_4_;
          fVar14 = auVar220._20_4_;
          fVar15 = auVar220._24_4_;
          fVar16 = auVar220._28_4_;
          switch(iVar25) {
          case 2:
            auVar343 = vminps_avx(auVar51,auVar49);
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
            auVar135._4_4_ = uVar1;
            auVar135._0_4_ = uVar1;
            auVar135._8_4_ = uVar1;
            auVar135._12_4_ = uVar1;
            auVar135._16_4_ = uVar1;
            auVar135._20_4_ = uVar1;
            auVar135._24_4_ = uVar1;
            auVar135._28_4_ = uVar1;
            auVar70 = vfmadd231ps_fma(auVar64,auVar343,auVar135);
            auVar64 = ZEXT1632(auVar70);
            break;
          case 3:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
            auVar89._4_4_ = uVar1;
            auVar89._0_4_ = uVar1;
            auVar89._8_4_ = uVar1;
            auVar89._12_4_ = uVar1;
            auVar89._16_4_ = uVar1;
            auVar89._20_4_ = uVar1;
            auVar89._24_4_ = uVar1;
            auVar89._28_4_ = uVar1;
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var4))[1];
            auVar144._4_4_ = uVar1;
            auVar144._0_4_ = uVar1;
            auVar144._8_4_ = uVar1;
            auVar144._12_4_ = uVar1;
            auVar144._16_4_ = uVar1;
            auVar144._20_4_ = uVar1;
            auVar144._24_4_ = uVar1;
            auVar144._28_4_ = uVar1;
            auVar64 = vmaxps_avx(auVar49,auVar89);
            auVar64 = vminps_avx(auVar64,auVar144);
            break;
          case 4:
            auVar50._0_8_ = auVar49._0_8_ ^ 0x8000000080000000;
            auVar50._8_4_ = -auVar49._8_4_;
            auVar50._12_4_ = -auVar49._12_4_;
            auVar50._16_4_ = -auVar49._16_4_;
            auVar50._20_4_ = -auVar49._20_4_;
            auVar50._24_4_ = -auVar49._24_4_;
            auVar50._28_4_ = -auVar49._28_4_;
            auVar90._8_4_ = 0x42b0c0a5;
            auVar90._0_8_ = 0x42b0c0a542b0c0a5;
            auVar90._12_4_ = 0x42b0c0a5;
            auVar90._16_4_ = 0x42b0c0a5;
            auVar90._20_4_ = 0x42b0c0a5;
            auVar90._24_4_ = 0x42b0c0a5;
            auVar90._28_4_ = 0x42b0c0a5;
            auVar64 = vminps_avx(auVar50,auVar90);
            auVar91._8_4_ = 0xc2b0c0a5;
            auVar91._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar91._12_4_ = 0xc2b0c0a5;
            auVar91._16_4_ = 0xc2b0c0a5;
            auVar91._20_4_ = 0xc2b0c0a5;
            auVar91._24_4_ = 0xc2b0c0a5;
            auVar91._28_4_ = 0xc2b0c0a5;
            auVar51 = vmaxps_avx(auVar64,auVar91);
            auVar92._8_4_ = 0x3fb8aa3b;
            auVar92._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar92._12_4_ = 0x3fb8aa3b;
            auVar92._16_4_ = 0x3fb8aa3b;
            auVar92._20_4_ = 0x3fb8aa3b;
            auVar92._24_4_ = 0x3fb8aa3b;
            auVar92._28_4_ = 0x3fb8aa3b;
            auVar243._8_4_ = 0x3f000000;
            auVar243._0_8_ = 0x3f0000003f000000;
            auVar243._12_4_ = 0x3f000000;
            auVar243._16_4_ = 0x3f000000;
            auVar243._20_4_ = 0x3f000000;
            auVar243._24_4_ = 0x3f000000;
            auVar243._28_4_ = 0x3f000000;
            auVar70 = vfmadd213ps_fma(auVar92,auVar51,auVar243);
            auVar54 = vroundps_avx(ZEXT1632(auVar70),1);
            auVar64 = vcmpps_avx(ZEXT1632(auVar70),auVar54,1);
            auVar64 = vandps_avx(auVar64,auVar343);
            auVar64 = vsubps_avx(auVar54,auVar64);
            auVar145._8_4_ = 0x3f318000;
            auVar145._0_8_ = 0x3f3180003f318000;
            auVar145._12_4_ = 0x3f318000;
            auVar145._16_4_ = 0x3f318000;
            auVar145._20_4_ = 0x3f318000;
            auVar145._24_4_ = 0x3f318000;
            auVar145._28_4_ = 0x3f318000;
            auVar70 = vfmsub231ps_fma(auVar51,auVar64,auVar145);
            auVar146._8_4_ = 0x395e8083;
            auVar146._0_8_ = 0x395e8083395e8083;
            auVar146._12_4_ = 0x395e8083;
            auVar146._16_4_ = 0x395e8083;
            auVar146._20_4_ = 0x395e8083;
            auVar146._24_4_ = 0x395e8083;
            auVar146._28_4_ = 0x395e8083;
            auVar110 = vfmsub231ps_fma(ZEXT1632(auVar70),auVar64,auVar146);
            auVar51 = ZEXT1632(auVar110);
            auVar19._28_4_ = 0x395e8083;
            auVar19._0_28_ =
                 ZEXT1628(CONCAT412(auVar110._12_4_ * auVar110._12_4_,
                                    CONCAT48(auVar110._8_4_ * auVar110._8_4_,
                                             CONCAT44(auVar110._4_4_ * auVar110._4_4_,
                                                      auVar110._0_4_ * auVar110._0_4_))));
            auVar196._8_4_ = 0x39506967;
            auVar196._0_8_ = 0x3950696739506967;
            auVar196._12_4_ = 0x39506967;
            auVar196._16_4_ = 0x39506967;
            auVar196._20_4_ = 0x39506967;
            auVar196._24_4_ = 0x39506967;
            auVar196._28_4_ = 0x39506967;
            auVar234._8_4_ = 0x3ab743ce;
            auVar234._0_8_ = 0x3ab743ce3ab743ce;
            auVar234._12_4_ = 0x3ab743ce;
            auVar234._16_4_ = 0x3ab743ce;
            auVar234._20_4_ = 0x3ab743ce;
            auVar234._24_4_ = 0x3ab743ce;
            auVar234._28_4_ = 0x3ab743ce;
            auVar70 = vfmadd213ps_fma(auVar196,auVar51,auVar234);
            auVar174._8_4_ = 0x3c088908;
            auVar174._0_8_ = 0x3c0889083c088908;
            auVar174._12_4_ = 0x3c088908;
            auVar174._16_4_ = 0x3c088908;
            auVar174._20_4_ = 0x3c088908;
            auVar174._24_4_ = 0x3c088908;
            auVar174._28_4_ = 0x3c088908;
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar51,auVar174);
            auVar175._8_4_ = 0x3d2aa9c1;
            auVar175._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar175._12_4_ = 0x3d2aa9c1;
            auVar175._16_4_ = 0x3d2aa9c1;
            auVar175._20_4_ = 0x3d2aa9c1;
            auVar175._24_4_ = 0x3d2aa9c1;
            auVar175._28_4_ = 0x3d2aa9c1;
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar51,auVar175);
            auVar176._8_4_ = 0x3e2aaaaa;
            auVar176._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar176._12_4_ = 0x3e2aaaaa;
            auVar176._16_4_ = 0x3e2aaaaa;
            auVar176._20_4_ = 0x3e2aaaaa;
            auVar176._24_4_ = 0x3e2aaaaa;
            auVar176._28_4_ = 0x3e2aaaaa;
            auVar51 = ZEXT1632(auVar110);
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar51,auVar176);
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar51,auVar243);
            auVar113 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar19,auVar51);
            auVar43._0_4_ = (int)auVar64._0_4_;
            auVar43._4_4_ = (int)auVar64._4_4_;
            auVar43._8_4_ = (int)auVar64._8_4_;
            auVar43._12_4_ = (int)auVar64._12_4_;
            auVar52._16_4_ = (int)auVar64._16_4_;
            auVar52._0_16_ = auVar43;
            auVar52._20_4_ = (int)auVar64._20_4_;
            auVar52._24_4_ = (int)auVar64._24_4_;
            auVar52._28_4_ = (int)auVar64._28_4_;
            auVar110 = vpslld_avx(auVar43,0x17);
            auVar70 = vpslld_avx(auVar52._16_16_,0x17);
            auVar111._8_4_ = 0x3f800000;
            auVar111._0_8_ = 0x3f8000003f800000;
            auVar111._12_4_ = 0x3f800000;
            auVar70 = vpaddd_avx(auVar70,auVar111);
            auVar110 = vpaddd_avx(auVar110,auVar111);
            auVar93._16_16_ = auVar70;
            auVar93._0_16_ = auVar110;
            auVar53._0_4_ = auVar113._0_4_ + fVar2;
            auVar53._4_4_ = auVar113._4_4_ + fVar154;
            auVar53._8_4_ = auVar113._8_4_ + fVar11;
            auVar53._12_4_ = auVar113._12_4_ + fVar12;
            auVar53._16_4_ = fVar13 + 0.0;
            auVar53._20_4_ = fVar14 + 0.0;
            auVar53._24_4_ = fVar15 + 0.0;
            auVar53._28_4_ = fVar16 + 0.0;
            auVar70 = vfmadd213ps_fma(auVar93,auVar53,auVar343);
            auVar64 = vrcpps_avx(ZEXT1632(auVar70));
            auVar70 = vfmsub213ps_fma(ZEXT1632(auVar70),auVar64,auVar343);
            auVar70 = vfnmadd132ps_fma(ZEXT1632(auVar70),auVar64,auVar64);
            auVar64 = ZEXT1632(auVar70);
            break;
          case 5:
            auVar313._8_4_ = 0x42b0c0a5;
            auVar313._0_8_ = 0x42b0c0a542b0c0a5;
            auVar313._12_4_ = 0x42b0c0a5;
            auVar313._16_4_ = 0x42b0c0a5;
            auVar313._20_4_ = 0x42b0c0a5;
            auVar313._24_4_ = 0x42b0c0a5;
            auVar313._28_4_ = 0x42b0c0a5;
            auVar64 = vminps_avx(auVar313,auVar49);
            auVar315._8_4_ = 0xc2b0c0a5;
            auVar315._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar315._12_4_ = 0xc2b0c0a5;
            auVar315._16_4_ = 0xc2b0c0a5;
            auVar315._20_4_ = 0xc2b0c0a5;
            auVar315._24_4_ = 0xc2b0c0a5;
            auVar315._28_4_ = 0xc2b0c0a5;
            auVar51 = vmaxps_avx(auVar315,auVar64);
            auVar136._8_4_ = 0x3fb8aa3b;
            auVar136._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar136._12_4_ = 0x3fb8aa3b;
            auVar136._16_4_ = 0x3fb8aa3b;
            auVar136._20_4_ = 0x3fb8aa3b;
            auVar136._24_4_ = 0x3fb8aa3b;
            auVar136._28_4_ = 0x3fb8aa3b;
            auVar342._8_4_ = 0x3f000000;
            auVar342._0_8_ = 0x3f0000003f000000;
            auVar342._12_4_ = 0x3f000000;
            auVar342._16_4_ = 0x3f000000;
            auVar342._20_4_ = 0x3f000000;
            auVar342._24_4_ = 0x3f000000;
            auVar342._28_4_ = 0x3f000000;
            auVar70 = vfmadd213ps_fma(auVar136,auVar51,auVar342);
            auVar54 = vroundps_avx(ZEXT1632(auVar70),1);
            auVar64 = vcmpps_avx(ZEXT1632(auVar70),auVar54,1);
            auVar64 = vandps_avx(auVar64,auVar343);
            auVar64 = vsubps_avx(auVar54,auVar64);
            auVar335._8_4_ = 0x3f318000;
            auVar335._0_8_ = 0x3f3180003f318000;
            auVar335._12_4_ = 0x3f318000;
            auVar335._16_4_ = 0x3f318000;
            auVar335._20_4_ = 0x3f318000;
            auVar335._24_4_ = 0x3f318000;
            auVar335._28_4_ = 0x3f318000;
            auVar70 = vfmsub231ps_fma(auVar51,auVar64,auVar335);
            auVar316._8_4_ = 0xb95e8083;
            auVar316._0_8_ = 0xb95e8083b95e8083;
            auVar316._12_4_ = 0xb95e8083;
            auVar316._16_4_ = 0xb95e8083;
            auVar316._20_4_ = 0xb95e8083;
            auVar316._24_4_ = 0xb95e8083;
            auVar316._28_4_ = 0xb95e8083;
            auVar110 = vfnmsub231ps_fma(ZEXT1632(auVar70),auVar64,auVar316);
            auVar51 = ZEXT1632(auVar110);
            auVar17._28_4_ = auVar54._28_4_;
            auVar17._0_28_ =
                 ZEXT1628(CONCAT412(auVar110._12_4_ * auVar110._12_4_,
                                    CONCAT48(auVar110._8_4_ * auVar110._8_4_,
                                             CONCAT44(auVar110._4_4_ * auVar110._4_4_,
                                                      auVar110._0_4_ * auVar110._0_4_))));
            auVar231._8_4_ = 0x39506967;
            auVar231._0_8_ = 0x3950696739506967;
            auVar231._12_4_ = 0x39506967;
            auVar231._16_4_ = 0x39506967;
            auVar231._20_4_ = 0x39506967;
            auVar231._24_4_ = 0x39506967;
            auVar231._28_4_ = 0x39506967;
            auVar338._8_4_ = 0x3ab743ce;
            auVar338._0_8_ = 0x3ab743ce3ab743ce;
            auVar338._12_4_ = 0x3ab743ce;
            auVar338._16_4_ = 0x3ab743ce;
            auVar338._20_4_ = 0x3ab743ce;
            auVar338._24_4_ = 0x3ab743ce;
            auVar338._28_4_ = 0x3ab743ce;
            auVar70 = vfmadd213ps_fma(auVar231,auVar51,auVar338);
            auVar173._8_4_ = 0x3c088908;
            auVar173._0_8_ = 0x3c0889083c088908;
            auVar173._12_4_ = 0x3c088908;
            auVar173._16_4_ = 0x3c088908;
            auVar173._20_4_ = 0x3c088908;
            auVar173._24_4_ = 0x3c088908;
            auVar173._28_4_ = 0x3c088908;
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar51,auVar173);
            auVar216._8_4_ = 0x3d2aa9c1;
            auVar216._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar216._12_4_ = 0x3d2aa9c1;
            auVar216._16_4_ = 0x3d2aa9c1;
            auVar216._20_4_ = 0x3d2aa9c1;
            auVar216._24_4_ = 0x3d2aa9c1;
            auVar216._28_4_ = 0x3d2aa9c1;
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar51,auVar216);
            auVar327._8_4_ = 0x3e2aaaaa;
            auVar327._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar327._12_4_ = 0x3e2aaaaa;
            auVar327._16_4_ = 0x3e2aaaaa;
            auVar327._20_4_ = 0x3e2aaaaa;
            auVar327._24_4_ = 0x3e2aaaaa;
            auVar327._28_4_ = 0x3e2aaaaa;
            auVar51 = ZEXT1632(auVar110);
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar51,auVar327);
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar51,auVar342);
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar17,auVar51);
            auVar193._0_4_ = auVar70._0_4_ + fVar2;
            auVar193._4_4_ = auVar70._4_4_ + fVar154;
            auVar193._8_4_ = auVar70._8_4_ + fVar11;
            auVar193._12_4_ = auVar70._12_4_ + fVar12;
            auVar193._16_4_ = fVar13 + 0.0;
            auVar193._20_4_ = fVar14 + 0.0;
            auVar193._24_4_ = fVar15 + 0.0;
            auVar193._28_4_ = fVar16 + 0.0;
            auVar69._0_4_ = (int)auVar64._0_4_;
            auVar69._4_4_ = (int)auVar64._4_4_;
            auVar69._8_4_ = (int)auVar64._8_4_;
            auVar69._12_4_ = (int)auVar64._12_4_;
            auVar85._16_4_ = (int)auVar64._16_4_;
            auVar85._0_16_ = auVar69;
            auVar85._20_4_ = (int)auVar64._20_4_;
            auVar85._24_4_ = (int)auVar64._24_4_;
            auVar85._28_4_ = (int)auVar64._28_4_;
            auVar110 = vpslld_avx(auVar69,0x17);
            auVar70 = vpslld_avx(auVar85._16_16_,0x17);
            auVar236._8_4_ = 0x3f800000;
            auVar236._0_8_ = 0x3f8000003f800000;
            auVar236._12_4_ = 0x3f800000;
            auVar70 = vpaddd_avx(auVar70,auVar236);
            auVar110 = vpaddd_avx(auVar110,auVar236);
            auVar86._16_16_ = auVar70;
            auVar86._0_16_ = auVar110;
            auVar113 = vfmadd213ps_fma(auVar86,auVar193,auVar343);
            auVar137._8_4_ = 0x800000;
            auVar137._0_8_ = 0x80000000800000;
            auVar137._12_4_ = 0x800000;
            auVar137._16_4_ = 0x800000;
            auVar137._20_4_ = 0x800000;
            auVar137._24_4_ = 0x800000;
            auVar137._28_4_ = 0x800000;
            auVar64 = vmaxps_avx(ZEXT1632(auVar113),auVar137);
            auVar110 = vpsrld_avx(auVar64._0_16_,0x17);
            auVar70 = vpsrld_avx(auVar64._16_16_,0x17);
            auVar256._8_4_ = 0x807fffff;
            auVar256._0_8_ = 0x807fffff807fffff;
            auVar256._12_4_ = 0x807fffff;
            auVar256._16_4_ = 0x807fffff;
            auVar256._20_4_ = 0x807fffff;
            auVar256._24_4_ = 0x807fffff;
            auVar256._28_4_ = 0x807fffff;
            auVar64 = vandps_avx(auVar256,auVar64);
            auVar54 = vorps_avx(auVar342,auVar64);
            auVar257._8_4_ = 0x3f3504f3;
            auVar257._0_8_ = 0x3f3504f33f3504f3;
            auVar257._12_4_ = 0x3f3504f3;
            auVar257._16_4_ = 0x3f3504f3;
            auVar257._20_4_ = 0x3f3504f3;
            auVar257._24_4_ = 0x3f3504f3;
            auVar257._28_4_ = 0x3f3504f3;
            auVar51 = vcmpps_avx(auVar257,auVar54,2);
            auVar64 = vandnps_avx(auVar51,auVar54);
            auVar314._8_4_ = 0xbf800000;
            auVar314._0_8_ = 0xbf800000bf800000;
            auVar314._12_4_ = 0xbf800000;
            auVar314._16_4_ = 0xbf800000;
            auVar314._20_4_ = 0xbf800000;
            auVar314._24_4_ = 0xbf800000;
            auVar314._28_4_ = 0xbf800000;
            auVar138._0_4_ = auVar64._0_4_ + auVar54._0_4_ + -1.0;
            auVar138._4_4_ = auVar64._4_4_ + auVar54._4_4_ + -1.0;
            auVar138._8_4_ = auVar64._8_4_ + auVar54._8_4_ + -1.0;
            auVar138._12_4_ = auVar64._12_4_ + auVar54._12_4_ + -1.0;
            auVar138._16_4_ = auVar64._16_4_ + auVar54._16_4_ + -1.0;
            auVar138._20_4_ = auVar64._20_4_ + auVar54._20_4_ + -1.0;
            auVar138._24_4_ = auVar64._24_4_ + auVar54._24_4_ + -1.0;
            auVar138._28_4_ = auVar64._28_4_ + auVar54._28_4_ + -1.0;
            auVar70 = vpsubd_avx(auVar70,auVar51._16_16_);
            auVar266._8_4_ = 0xffffff81;
            auVar266._0_8_ = 0xffffff81ffffff81;
            auVar266._12_4_ = 0xffffff81;
            auVar70 = vpaddd_avx(auVar266,auVar70);
            auVar110 = vpsubd_avx(auVar110,auVar51._0_16_);
            auVar110 = vpaddd_avx(auVar266,auVar110);
            auVar194._16_16_ = auVar70;
            auVar194._0_16_ = auVar110;
            auVar232._0_4_ = auVar138._0_4_ * auVar138._0_4_;
            auVar232._4_4_ = auVar138._4_4_ * auVar138._4_4_;
            auVar232._8_4_ = auVar138._8_4_ * auVar138._8_4_;
            auVar232._12_4_ = auVar138._12_4_ * auVar138._12_4_;
            auVar232._16_4_ = auVar138._16_4_ * auVar138._16_4_;
            auVar232._20_4_ = auVar138._20_4_ * auVar138._20_4_;
            auVar232._24_4_ = auVar138._24_4_ * auVar138._24_4_;
            auVar232._28_4_ = 0;
            auVar258._8_4_ = 0x3d9021bb;
            auVar258._0_8_ = 0x3d9021bb3d9021bb;
            auVar258._12_4_ = 0x3d9021bb;
            auVar258._16_4_ = 0x3d9021bb;
            auVar258._20_4_ = 0x3d9021bb;
            auVar258._24_4_ = 0x3d9021bb;
            auVar258._28_4_ = 0x3d9021bb;
            auVar283._8_4_ = 0xbdebd1b8;
            auVar283._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar283._12_4_ = 0xbdebd1b8;
            auVar283._16_4_ = 0xbdebd1b8;
            auVar283._20_4_ = 0xbdebd1b8;
            auVar283._24_4_ = 0xbdebd1b8;
            auVar283._28_4_ = 0xbdebd1b8;
            auVar70 = vfmadd213ps_fma(auVar258,auVar138,auVar283);
            auVar284._8_4_ = 0x3def251a;
            auVar284._0_8_ = 0x3def251a3def251a;
            auVar284._12_4_ = 0x3def251a;
            auVar284._16_4_ = 0x3def251a;
            auVar284._20_4_ = 0x3def251a;
            auVar284._24_4_ = 0x3def251a;
            auVar284._28_4_ = 0x3def251a;
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar138,auVar284);
            auVar285._8_4_ = 0xbdfe5d4f;
            auVar285._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar285._12_4_ = 0xbdfe5d4f;
            auVar285._16_4_ = 0xbdfe5d4f;
            auVar285._20_4_ = 0xbdfe5d4f;
            auVar285._24_4_ = 0xbdfe5d4f;
            auVar285._28_4_ = 0xbdfe5d4f;
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar138,auVar285);
            auVar286._8_4_ = 0x3e11e9bf;
            auVar286._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar286._12_4_ = 0x3e11e9bf;
            auVar286._16_4_ = 0x3e11e9bf;
            auVar286._20_4_ = 0x3e11e9bf;
            auVar286._24_4_ = 0x3e11e9bf;
            auVar286._28_4_ = 0x3e11e9bf;
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar138,auVar286);
            auVar287._8_4_ = 0xbe2aae50;
            auVar287._0_8_ = 0xbe2aae50be2aae50;
            auVar287._12_4_ = 0xbe2aae50;
            auVar287._16_4_ = 0xbe2aae50;
            auVar287._20_4_ = 0xbe2aae50;
            auVar287._24_4_ = 0xbe2aae50;
            auVar287._28_4_ = 0xbe2aae50;
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar138,auVar287);
            auVar288._8_4_ = 0x3e4cceac;
            auVar288._0_8_ = 0x3e4cceac3e4cceac;
            auVar288._12_4_ = 0x3e4cceac;
            auVar288._16_4_ = 0x3e4cceac;
            auVar288._20_4_ = 0x3e4cceac;
            auVar288._24_4_ = 0x3e4cceac;
            auVar288._28_4_ = 0x3e4cceac;
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar138,auVar288);
            auVar289._8_4_ = 0xbe7ffffc;
            auVar289._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar289._12_4_ = 0xbe7ffffc;
            auVar289._16_4_ = 0xbe7ffffc;
            auVar289._20_4_ = 0xbe7ffffc;
            auVar289._24_4_ = 0xbe7ffffc;
            auVar289._28_4_ = 0xbe7ffffc;
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar138,auVar289);
            auVar290._8_4_ = 0x3eaaaaaa;
            auVar290._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar290._12_4_ = 0x3eaaaaaa;
            auVar290._16_4_ = 0x3eaaaaaa;
            auVar290._20_4_ = 0x3eaaaaaa;
            auVar290._24_4_ = 0x3eaaaaaa;
            auVar290._28_4_ = 0x3eaaaaaa;
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar138,auVar290);
            auVar259._0_4_ = auVar232._0_4_ * auVar138._0_4_ * auVar70._0_4_;
            auVar259._4_4_ = auVar232._4_4_ * auVar138._4_4_ * auVar70._4_4_;
            auVar259._8_4_ = auVar232._8_4_ * auVar138._8_4_ * auVar70._8_4_;
            auVar259._12_4_ = auVar232._12_4_ * auVar138._12_4_ * auVar70._12_4_;
            auVar259._16_4_ = auVar232._16_4_ * auVar138._16_4_ * 0.0;
            auVar259._20_4_ = auVar232._20_4_ * auVar138._20_4_ * 0.0;
            auVar259._24_4_ = auVar232._24_4_ * auVar138._24_4_ * 0.0;
            auVar259._28_4_ = 0;
            auVar51 = vcvtdq2ps_avx(auVar194);
            auVar70 = vfmadd231ps_fma(auVar259,auVar51,auVar316);
            auVar70 = vfmsub231ps_fma(ZEXT1632(auVar70),auVar342,auVar232);
            auVar64 = vcmpps_avx(ZEXT1632(auVar113),_DAT_004f0900,2);
            auVar54 = vsubps_avx(ZEXT1632(auVar70),auVar138);
            auVar70 = vfmsub231ps_fma(auVar54,auVar335,auVar51);
            auVar291._8_4_ = 0xc0000000;
            auVar291._0_8_ = 0xc0000000c0000000;
            auVar291._12_4_ = 0xc0000000;
            auVar291._16_4_ = 0xc0000000;
            auVar291._20_4_ = 0xc0000000;
            auVar291._24_4_ = 0xc0000000;
            auVar291._28_4_ = 0xc0000000;
            auVar139._0_4_ = auVar70._0_4_ * -2.0;
            auVar139._4_4_ = auVar70._4_4_ * -2.0;
            auVar139._8_4_ = auVar70._8_4_ * -2.0;
            auVar139._12_4_ = auVar70._12_4_ * -2.0;
            auVar139._16_4_ = 0x80000000;
            auVar139._20_4_ = 0x80000000;
            auVar139._24_4_ = 0x80000000;
            auVar139._28_4_ = 0;
            auVar195._8_4_ = 0x7fffffff;
            auVar195._0_8_ = 0x7fffffff7fffffff;
            auVar195._12_4_ = 0x7fffffff;
            auVar195._16_4_ = 0x7fffffff;
            auVar195._20_4_ = 0x7fffffff;
            auVar195._24_4_ = 0x7fffffff;
            auVar195._28_4_ = 0x7fffffff;
            auVar64 = vblendvps_avx(auVar139,auVar195,auVar64);
            auVar140._8_4_ = 0x42b0c0a5;
            auVar140._0_8_ = 0x42b0c0a542b0c0a5;
            auVar140._12_4_ = 0x42b0c0a5;
            auVar140._16_4_ = 0x42b0c0a5;
            auVar140._20_4_ = 0x42b0c0a5;
            auVar140._24_4_ = 0x42b0c0a5;
            auVar140._28_4_ = 0x42b0c0a5;
            auVar64 = vminps_avx(auVar64,auVar140);
            auVar141._8_4_ = 0xc2b0c0a5;
            auVar141._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar141._12_4_ = 0xc2b0c0a5;
            auVar141._16_4_ = 0xc2b0c0a5;
            auVar141._20_4_ = 0xc2b0c0a5;
            auVar141._24_4_ = 0xc2b0c0a5;
            auVar141._28_4_ = 0xc2b0c0a5;
            auVar51 = vmaxps_avx(auVar64,auVar141);
            auVar142._8_4_ = 0x3fb8aa3b;
            auVar142._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar142._12_4_ = 0x3fb8aa3b;
            auVar142._16_4_ = 0x3fb8aa3b;
            auVar142._20_4_ = 0x3fb8aa3b;
            auVar142._24_4_ = 0x3fb8aa3b;
            auVar142._28_4_ = 0x3fb8aa3b;
            auVar70 = vfmadd213ps_fma(auVar142,auVar51,auVar342);
            auVar54 = vroundps_avx(ZEXT1632(auVar70),1);
            auVar64 = vcmpps_avx(ZEXT1632(auVar70),auVar54,1);
            auVar64 = vandps_avx(auVar64,auVar343);
            auVar64 = vsubps_avx(auVar54,auVar64);
            auVar70 = vfmsub231ps_fma(auVar51,auVar64,auVar335);
            auVar110 = vfnmsub231ps_fma(ZEXT1632(auVar70),auVar64,auVar316);
            auVar51 = ZEXT1632(auVar110);
            auVar18._28_4_ = auVar54._28_4_;
            auVar18._0_28_ =
                 ZEXT1628(CONCAT412(auVar110._12_4_ * auVar110._12_4_,
                                    CONCAT48(auVar110._8_4_ * auVar110._8_4_,
                                             CONCAT44(auVar110._4_4_ * auVar110._4_4_,
                                                      auVar110._0_4_ * auVar110._0_4_))));
            auVar233._8_4_ = 0x39506967;
            auVar233._0_8_ = 0x3950696739506967;
            auVar233._12_4_ = 0x39506967;
            auVar233._16_4_ = 0x39506967;
            auVar233._20_4_ = 0x39506967;
            auVar233._24_4_ = 0x39506967;
            auVar233._28_4_ = 0x39506967;
            auVar344 = ZEXT864(0) << 0x20;
            auVar70 = vfmadd213ps_fma(auVar233,auVar51,auVar338);
            auVar317._8_4_ = 0x3c088908;
            auVar317._0_8_ = 0x3c0889083c088908;
            auVar317._12_4_ = 0x3c088908;
            auVar317._16_4_ = 0x3c088908;
            auVar317._20_4_ = 0x3c088908;
            auVar317._24_4_ = 0x3c088908;
            auVar317._28_4_ = 0x3c088908;
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar51,auVar317);
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar51,auVar216);
            auVar220 = ZEXT3264(auVar343);
            auVar51 = ZEXT1632(auVar110);
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar51,auVar327);
            auVar70 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar51,auVar342);
            auVar113 = vfmadd213ps_fma(ZEXT1632(auVar70),auVar18,auVar51);
            auVar71._0_4_ = (int)auVar64._0_4_;
            auVar71._4_4_ = (int)auVar64._4_4_;
            auVar71._8_4_ = (int)auVar64._8_4_;
            auVar71._12_4_ = (int)auVar64._12_4_;
            auVar87._16_4_ = (int)auVar64._16_4_;
            auVar87._0_16_ = auVar71;
            auVar87._20_4_ = (int)auVar64._20_4_;
            auVar87._24_4_ = (int)auVar64._24_4_;
            auVar87._28_4_ = (int)auVar64._28_4_;
            auVar110 = vpslld_avx(auVar71,0x17);
            auVar70 = vpslld_avx(auVar87._16_16_,0x17);
            auVar70 = vpaddd_avx(auVar70,auVar236);
            auVar110 = vpaddd_avx(auVar110,auVar236);
            auVar88._16_16_ = auVar70;
            auVar88._0_16_ = auVar110;
            auVar143._0_4_ = auVar113._0_4_ + fVar2;
            auVar143._4_4_ = auVar113._4_4_ + fVar154;
            auVar143._8_4_ = auVar113._8_4_ + fVar11;
            auVar143._12_4_ = auVar113._12_4_ + fVar12;
            auVar143._16_4_ = fVar13 + 0.0;
            auVar143._20_4_ = fVar14 + 0.0;
            auVar143._24_4_ = fVar15 + 0.0;
            auVar143._28_4_ = fVar16 + 0.0;
            auVar70 = vfmadd213ps_fma(auVar88,auVar143,auVar343);
            auVar64 = vrcpps_avx(ZEXT1632(auVar70));
            auVar70 = vfmsub213ps_fma(ZEXT1632(auVar70),auVar64,auVar343);
            auVar70 = vfnmadd132ps_fma(ZEXT1632(auVar70),auVar64,auVar64);
            auVar70 = vfnmadd213ps_fma(ZEXT1632(auVar70),auVar291,auVar314);
            auVar65 = ZEXT1664(auVar70);
            goto LAB_002a834c;
          case 6:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var4);
            auVar94._4_4_ = uVar1;
            auVar94._0_4_ = uVar1;
            auVar94._8_4_ = uVar1;
            auVar94._12_4_ = uVar1;
            auVar94._16_4_ = uVar1;
            auVar94._20_4_ = uVar1;
            auVar94._24_4_ = uVar1;
            auVar94._28_4_ = uVar1;
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var4))[1];
            auVar147._4_4_ = uVar1;
            auVar147._0_4_ = uVar1;
            auVar147._8_4_ = uVar1;
            auVar147._12_4_ = uVar1;
            auVar147._16_4_ = uVar1;
            auVar147._20_4_ = uVar1;
            auVar147._24_4_ = uVar1;
            auVar147._28_4_ = uVar1;
            auVar70 = vfmadd231ps_fma(auVar147,auVar49,auVar94);
            auVar64 = vmaxps_avx(auVar51,ZEXT1632(auVar70));
            auVar64 = vminps_avx(auVar64,auVar343);
            auVar65 = ZEXT3264(auVar64);
LAB_002a834c:
            auVar109._0_4_ = auVar65._0_4_ * fVar42;
            auVar109._4_4_ = auVar65._4_4_ * fVar67;
            auVar109._8_4_ = auVar65._8_4_ * auVar49._8_4_;
            auVar109._12_4_ = auVar65._12_4_ * auVar49._12_4_;
            auVar109._16_4_ = auVar65._16_4_ * auVar49._16_4_;
            auVar109._20_4_ = auVar65._20_4_ * auVar49._20_4_;
            auVar109._28_36_ = auVar65._28_36_;
            auVar109._24_4_ = auVar65._24_4_ * auVar49._24_4_;
            auVar64 = auVar109._0_32_;
          }
switchD_002a7ef5_caseD_1:
          *(undefined1 (*) [32])((long)top_blob->data + uVar27 * 0x20) = auVar64;
        }
      }
    }
  }
  if ((int *)local_d8._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_d8._8_8_ = *(int *)local_d8._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_d8._8_8_ == 0) {
      if (local_b8 == (Allocator *)0x0) {
        free((void *)local_d8._0_8_);
      }
      else {
        (*local_b8->_vptr_Allocator[3])();
      }
    }
  }
  return local_140;
}

Assistant:

int InnerProduct_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}